

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack8.h
# Opt level: O0

void ncnn::convdw5x5s2_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [32];
  __m256 _k44;
  __m256 _k43;
  __m256 _k42;
  __m256 _k41;
  __m256 _k40;
  __m256 _r44;
  __m256 _r43;
  __m256 _r42;
  __m256 _r41;
  __m256 _r40;
  __m256 _k34;
  __m256 _k33;
  __m256 _k32;
  __m256 _k31;
  __m256 _k30;
  __m256 _r34;
  __m256 _r33;
  __m256 _r32;
  __m256 _r31;
  __m256 _r30;
  __m256 _k24;
  __m256 _k23;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _r24;
  __m256 _r23;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _k14;
  __m256 _k13;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _k04;
  __m256 _k03;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum0;
  int j;
  int i;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  float in_stack_ffffffffffffd62c;
  float in_stack_ffffffffffffd630;
  float in_stack_ffffffffffffd634;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  int local_1998;
  int local_1994;
  float *local_1990;
  float *local_1988;
  float *local_1980;
  float *local_1978;
  float *local_1970;
  Mat local_1968;
  float *local_1920;
  float *local_1918;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  Mat local_18d8;
  int local_188c;
  float *local_1888;
  int local_187c;
  int local_1878;
  int local_1874;
  int local_1870;
  int local_186c;
  Mat *local_1858;
  undefined4 local_183c;
  float *local_1838;
  float *local_1830;
  float *local_1828;
  float *local_1820;
  float *local_1818;
  float *local_1810;
  float *local_1808;
  float *local_1800;
  float *local_17f8;
  float *local_17f0;
  float *local_17e8;
  float *local_17e0;
  float *local_17d8;
  float *local_17d0;
  float *local_17c8;
  float *local_17c0;
  float *local_17b8;
  float *local_17b0;
  float *local_17a8;
  float *local_17a0;
  float *local_1798;
  float *local_1790;
  float *local_1788;
  float *local_1780;
  float *local_1778;
  float *local_1770;
  float *local_1768;
  float *local_1760;
  float *local_1758;
  float *local_1750;
  float *local_1748;
  float *local_1740;
  float *local_1738;
  float *local_1730;
  float *local_1728;
  float *local_1720;
  float *local_1718;
  float *local_1710;
  float *local_1708;
  float *local_1700;
  float *local_16f8;
  float *local_16f0;
  float *local_16e8;
  float *local_16e0;
  float *local_16d8;
  float *local_16d0;
  float *local_16c8;
  float *local_16c0;
  float *local_16b8;
  float *local_16b0;
  float *local_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float *local_d08;
  undefined1 local_d00 [32];
  undefined4 local_ce0;
  undefined4 local_cdc;
  undefined4 local_cd8;
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined4 local_ccc;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  
  local_186c = *(int *)(in_RDI + 0x2c);
  local_1870 = *(int *)(in_RSI + 0x2c);
  local_1874 = *(int *)(in_RSI + 0x30);
  local_1878 = *(int *)(in_RDI + 0x38);
  local_187c = (local_186c * 2 + local_1870 * -2) * 8;
  local_1858 = in_RDX;
  local_1888 = Mat::operator_cast_to_float_(in_RCX);
  for (local_188c = 0; local_188c < local_1878; local_188c = local_188c + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630),
                 (int)in_stack_ffffffffffffd62c);
    if (local_1888 == (float *)0x0) {
      local_183c = 0;
      local_cc4 = 0;
      local_cc8 = 0;
      local_ccc = 0;
      local_cd0 = 0;
      local_cd4 = 0;
      local_cd8 = 0;
      local_cdc = 0;
      local_ce0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar104._16_16_ = auVar1;
      auVar104._0_16_ = auVar2;
      local_d00._0_8_ = auVar2._0_8_;
      local_d00._8_8_ = auVar2._8_8_;
      local_d00._16_8_ = auVar1._0_8_;
      local_d00._24_8_ = auVar1._8_8_;
      local_2040 = local_d00._0_8_;
      uStack_2038 = local_d00._8_8_;
      uStack_2030 = local_d00._16_8_;
      uStack_2028 = local_d00._24_8_;
      local_d00 = auVar104;
    }
    else {
      local_16a8 = local_1888 + (local_188c << 3);
      local_2040 = *(undefined8 *)local_16a8;
      uStack_2038 = *(undefined8 *)(local_16a8 + 2);
      uStack_2030 = *(undefined8 *)(local_16a8 + 4);
      uStack_2028 = *(undefined8 *)(local_16a8 + 6);
    }
    local_1900 = local_2040;
    uStack_18f8 = uStack_2038;
    uStack_18f0 = uStack_2030;
    uStack_18e8 = uStack_2028;
    local_1918 = Mat::row(local_1858,local_188c);
    local_1920 = Mat::row(&local_18d8,0);
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630),
                 (int)in_stack_ffffffffffffd62c);
    local_1970 = Mat::row(&local_1968,0);
    local_1978 = Mat::row(&local_1968,1);
    local_1980 = Mat::row(&local_1968,2);
    local_1988 = Mat::row(&local_1968,3);
    local_1990 = Mat::row(&local_1968,4);
    for (local_1994 = 0; local_1994 < local_1874; local_1994 = local_1994 + 1) {
      for (local_1998 = 0; local_1998 < local_1870; local_1998 = local_1998 + 1) {
        local_16b0 = local_1970;
        local_d80 = *(undefined8 *)local_1970;
        uStack_d78 = *(undefined8 *)(local_1970 + 2);
        uStack_d70 = *(undefined8 *)(local_1970 + 4);
        uStack_d68 = *(undefined8 *)(local_1970 + 6);
        local_16b8 = local_1970 + 8;
        local_de0 = *(undefined8 *)local_16b8;
        uStack_dd8 = *(undefined8 *)(local_1970 + 10);
        uStack_dd0 = *(undefined8 *)(local_1970 + 0xc);
        uStack_dc8 = *(undefined8 *)(local_1970 + 0xe);
        local_16c0 = local_1970 + 0x10;
        local_e40 = *(undefined8 *)local_16c0;
        uStack_e38 = *(undefined8 *)(local_1970 + 0x12);
        uStack_e30 = *(undefined8 *)(local_1970 + 0x14);
        uStack_e28 = *(undefined8 *)(local_1970 + 0x16);
        local_16c8 = local_1970 + 0x18;
        local_ea0 = *(undefined8 *)local_16c8;
        uStack_e98 = *(undefined8 *)(local_1970 + 0x1a);
        uStack_e90 = *(undefined8 *)(local_1970 + 0x1c);
        uStack_e88 = *(undefined8 *)(local_1970 + 0x1e);
        local_16d0 = local_1970 + 0x20;
        local_f00 = *(undefined8 *)local_16d0;
        uStack_ef8 = *(undefined8 *)(local_1970 + 0x22);
        uStack_ef0 = *(undefined8 *)(local_1970 + 0x24);
        uStack_ee8 = *(undefined8 *)(local_1970 + 0x26);
        local_16d8 = local_1918;
        uVar3 = *(undefined8 *)local_1918;
        uVar4 = *(undefined8 *)(local_1918 + 2);
        uVar5 = *(undefined8 *)(local_1918 + 4);
        uVar6 = *(undefined8 *)(local_1918 + 6);
        local_16e0 = local_1918 + 8;
        uVar7 = *(undefined8 *)local_16e0;
        uVar8 = *(undefined8 *)(local_1918 + 10);
        uVar9 = *(undefined8 *)(local_1918 + 0xc);
        uVar10 = *(undefined8 *)(local_1918 + 0xe);
        local_16e8 = local_1918 + 0x10;
        uVar11 = *(undefined8 *)local_16e8;
        uVar12 = *(undefined8 *)(local_1918 + 0x12);
        uVar13 = *(undefined8 *)(local_1918 + 0x14);
        uVar14 = *(undefined8 *)(local_1918 + 0x16);
        local_16f0 = local_1918 + 0x18;
        uVar15 = *(undefined8 *)local_16f0;
        uVar16 = *(undefined8 *)(local_1918 + 0x1a);
        uVar17 = *(undefined8 *)(local_1918 + 0x1c);
        uVar18 = *(undefined8 *)(local_1918 + 0x1e);
        local_16f8 = local_1918 + 0x20;
        uVar19 = *(undefined8 *)local_16f8;
        uVar20 = *(undefined8 *)(local_1918 + 0x22);
        uVar21 = *(undefined8 *)(local_1918 + 0x24);
        uVar22 = *(undefined8 *)(local_1918 + 0x26);
        local_1728 = local_1918 + 0x28;
        local_da0 = local_1900;
        uStack_d98 = uStack_18f8;
        uStack_d90 = uStack_18f0;
        uStack_d88 = uStack_18e8;
        local_d60._0_4_ = (float)uVar3;
        local_660 = (float)local_d60;
        local_d60._4_4_ = (float)((ulong)uVar3 >> 0x20);
        fStack_65c = local_d60._4_4_;
        uStack_d58._0_4_ = (float)uVar4;
        fStack_658 = (float)uStack_d58;
        uStack_d58._4_4_ = (float)((ulong)uVar4 >> 0x20);
        fStack_654 = uStack_d58._4_4_;
        uStack_d50._0_4_ = (float)uVar5;
        fStack_650 = (float)uStack_d50;
        uStack_d50._4_4_ = (float)((ulong)uVar5 >> 0x20);
        fStack_64c = uStack_d50._4_4_;
        uStack_d48._0_4_ = (float)uVar6;
        fStack_648 = (float)uStack_d48;
        uStack_d48._4_4_ = (float)((ulong)uVar6 >> 0x20);
        fStack_c84 = uStack_d48._4_4_;
        local_680._0_4_ = (float)local_d80;
        local_680._4_4_ = (float)((ulong)local_d80 >> 0x20);
        uStack_678._0_4_ = (float)uStack_d78;
        uStack_678._4_4_ = (float)((ulong)uStack_d78 >> 0x20);
        uStack_670._0_4_ = (float)uStack_d70;
        uStack_670._4_4_ = (float)((ulong)uStack_d70 >> 0x20);
        uStack_668._0_4_ = (float)uStack_d68;
        local_ca0 = (float)local_d60 * (float)local_680;
        fStack_c9c = local_d60._4_4_ * local_680._4_4_;
        fStack_c98 = (float)uStack_d58 * (float)uStack_678;
        fStack_c94 = uStack_d58._4_4_ * uStack_678._4_4_;
        fStack_c90 = (float)uStack_d50 * (float)uStack_670;
        fStack_c8c = uStack_d50._4_4_ * uStack_670._4_4_;
        fStack_c88 = (float)uStack_d48 * (float)uStack_668;
        local_cc0._0_4_ = (float)local_1900;
        local_cc0._4_4_ = (float)((ulong)local_1900 >> 0x20);
        uStack_cb8._0_4_ = (float)uStack_18f8;
        uStack_cb8._4_4_ = (float)((ulong)uStack_18f8 >> 0x20);
        uStack_cb0._0_4_ = (float)uStack_18f0;
        uStack_cb0._4_4_ = (float)((ulong)uStack_18f0 >> 0x20);
        uStack_ca8._0_4_ = (float)uStack_18e8;
        uStack_ca8._4_4_ = (float)((ulong)uStack_18e8 >> 0x20);
        local_e00 = CONCAT44(fStack_c9c + local_cc0._4_4_,local_ca0 + (float)local_cc0);
        uStack_df8 = CONCAT44(fStack_c94 + uStack_cb8._4_4_,fStack_c98 + (float)uStack_cb8);
        uStack_df0 = CONCAT44(fStack_c8c + uStack_cb0._4_4_,fStack_c90 + (float)uStack_cb0);
        uStack_de8 = CONCAT44(uStack_d48._4_4_ + uStack_ca8._4_4_,fStack_c88 + (float)uStack_ca8);
        local_dc0._0_4_ = (float)uVar7;
        local_620 = (float)local_dc0;
        local_dc0._4_4_ = (float)((ulong)uVar7 >> 0x20);
        fStack_61c = local_dc0._4_4_;
        uStack_db8._0_4_ = (float)uVar8;
        fStack_618 = (float)uStack_db8;
        uStack_db8._4_4_ = (float)((ulong)uVar8 >> 0x20);
        fStack_614 = uStack_db8._4_4_;
        uStack_db0._0_4_ = (float)uVar9;
        fStack_610 = (float)uStack_db0;
        uStack_db0._4_4_ = (float)((ulong)uVar9 >> 0x20);
        fStack_60c = uStack_db0._4_4_;
        uStack_da8._0_4_ = (float)uVar10;
        fStack_608 = (float)uStack_da8;
        uStack_da8._4_4_ = (float)((ulong)uVar10 >> 0x20);
        fStack_c44 = uStack_da8._4_4_;
        local_640._0_4_ = (float)local_de0;
        local_640._4_4_ = (float)((ulong)local_de0 >> 0x20);
        uStack_638._0_4_ = (float)uStack_dd8;
        uStack_638._4_4_ = (float)((ulong)uStack_dd8 >> 0x20);
        uStack_630._0_4_ = (float)uStack_dd0;
        uStack_630._4_4_ = (float)((ulong)uStack_dd0 >> 0x20);
        uStack_628._0_4_ = (float)uStack_dc8;
        local_c60 = (float)local_dc0 * (float)local_640;
        fStack_c5c = local_dc0._4_4_ * local_640._4_4_;
        fStack_c58 = (float)uStack_db8 * (float)uStack_638;
        fStack_c54 = uStack_db8._4_4_ * uStack_638._4_4_;
        fStack_c50 = (float)uStack_db0 * (float)uStack_630;
        fStack_c4c = uStack_db0._4_4_ * uStack_630._4_4_;
        fStack_c48 = (float)uStack_da8 * (float)uStack_628;
        fVar103 = local_c60 + local_ca0 + (float)local_cc0;
        fVar105 = fStack_c5c + fStack_c9c + local_cc0._4_4_;
        fVar106 = fStack_c58 + fStack_c98 + (float)uStack_cb8;
        in_stack_ffffffffffffd62c = fStack_c54 + fStack_c94 + uStack_cb8._4_4_;
        in_stack_ffffffffffffd630 = fStack_c50 + fStack_c90 + (float)uStack_cb0;
        in_stack_ffffffffffffd634 = fStack_c4c + fStack_c8c + uStack_cb0._4_4_;
        fVar107 = fStack_c48 + fStack_c88 + (float)uStack_ca8;
        uStack_da8._4_4_ = uStack_da8._4_4_ + uStack_d48._4_4_ + uStack_ca8._4_4_;
        local_e60 = CONCAT44(fVar105,fVar103);
        uStack_e58 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_e50 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_e48 = CONCAT44(uStack_da8._4_4_,fVar107);
        local_e20._0_4_ = (float)uVar11;
        local_5e0 = (float)local_e20;
        local_e20._4_4_ = (float)((ulong)uVar11 >> 0x20);
        fStack_5dc = local_e20._4_4_;
        uStack_e18._0_4_ = (float)uVar12;
        fStack_5d8 = (float)uStack_e18;
        uStack_e18._4_4_ = (float)((ulong)uVar12 >> 0x20);
        fStack_5d4 = uStack_e18._4_4_;
        uStack_e10._0_4_ = (float)uVar13;
        fStack_5d0 = (float)uStack_e10;
        uStack_e10._4_4_ = (float)((ulong)uVar13 >> 0x20);
        fStack_5cc = uStack_e10._4_4_;
        uStack_e08._0_4_ = (float)uVar14;
        fStack_5c8 = (float)uStack_e08;
        uStack_e08._4_4_ = (float)((ulong)uVar14 >> 0x20);
        fStack_c04 = uStack_e08._4_4_;
        local_600._0_4_ = (float)local_e40;
        local_600._4_4_ = (float)((ulong)local_e40 >> 0x20);
        uStack_5f8._0_4_ = (float)uStack_e38;
        uStack_5f8._4_4_ = (float)((ulong)uStack_e38 >> 0x20);
        uStack_5f0._0_4_ = (float)uStack_e30;
        uStack_5f0._4_4_ = (float)((ulong)uStack_e30 >> 0x20);
        uStack_5e8._0_4_ = (float)uStack_e28;
        local_c20 = (float)local_e20 * (float)local_600;
        fStack_c1c = local_e20._4_4_ * local_600._4_4_;
        fStack_c18 = (float)uStack_e18 * (float)uStack_5f8;
        fStack_c14 = uStack_e18._4_4_ * uStack_5f8._4_4_;
        fStack_c10 = (float)uStack_e10 * (float)uStack_5f0;
        fStack_c0c = uStack_e10._4_4_ * uStack_5f0._4_4_;
        fStack_c08 = (float)uStack_e08 * (float)uStack_5e8;
        fVar103 = local_c20 + fVar103;
        fVar105 = fStack_c1c + fVar105;
        fVar106 = fStack_c18 + fVar106;
        in_stack_ffffffffffffd62c = fStack_c14 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_c10 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_c0c + in_stack_ffffffffffffd634;
        fVar107 = fStack_c08 + fVar107;
        uStack_e08._4_4_ = uStack_e08._4_4_ + uStack_da8._4_4_;
        local_ec0 = CONCAT44(fVar105,fVar103);
        uStack_eb8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_eb0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_ea8 = CONCAT44(uStack_e08._4_4_,fVar107);
        local_e80._0_4_ = (float)uVar15;
        local_5a0 = (float)local_e80;
        local_e80._4_4_ = (float)((ulong)uVar15 >> 0x20);
        fStack_59c = local_e80._4_4_;
        uStack_e78._0_4_ = (float)uVar16;
        fStack_598 = (float)uStack_e78;
        uStack_e78._4_4_ = (float)((ulong)uVar16 >> 0x20);
        fStack_594 = uStack_e78._4_4_;
        uStack_e70._0_4_ = (float)uVar17;
        fStack_590 = (float)uStack_e70;
        uStack_e70._4_4_ = (float)((ulong)uVar17 >> 0x20);
        fStack_58c = uStack_e70._4_4_;
        uStack_e68._0_4_ = (float)uVar18;
        fStack_588 = (float)uStack_e68;
        uStack_e68._4_4_ = (float)((ulong)uVar18 >> 0x20);
        fStack_bc4 = uStack_e68._4_4_;
        local_5c0._0_4_ = (float)local_ea0;
        local_5c0._4_4_ = (float)((ulong)local_ea0 >> 0x20);
        uStack_5b8._0_4_ = (float)uStack_e98;
        uStack_5b8._4_4_ = (float)((ulong)uStack_e98 >> 0x20);
        uStack_5b0._0_4_ = (float)uStack_e90;
        uStack_5b0._4_4_ = (float)((ulong)uStack_e90 >> 0x20);
        uStack_5a8._0_4_ = (float)uStack_e88;
        local_be0 = (float)local_e80 * (float)local_5c0;
        fStack_bdc = local_e80._4_4_ * local_5c0._4_4_;
        fStack_bd8 = (float)uStack_e78 * (float)uStack_5b8;
        fStack_bd4 = uStack_e78._4_4_ * uStack_5b8._4_4_;
        fStack_bd0 = (float)uStack_e70 * (float)uStack_5b0;
        fStack_bcc = uStack_e70._4_4_ * uStack_5b0._4_4_;
        fStack_bc8 = (float)uStack_e68 * (float)uStack_5a8;
        fVar103 = local_be0 + fVar103;
        fVar105 = fStack_bdc + fVar105;
        fVar106 = fStack_bd8 + fVar106;
        in_stack_ffffffffffffd62c = fStack_bd4 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_bd0 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_bcc + in_stack_ffffffffffffd634;
        fVar107 = fStack_bc8 + fVar107;
        uStack_e68._4_4_ = uStack_e68._4_4_ + uStack_e08._4_4_;
        local_f20 = CONCAT44(fVar105,fVar103);
        uStack_f18 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_f10 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_f08 = CONCAT44(uStack_e68._4_4_,fVar107);
        local_ee0._0_4_ = (float)uVar19;
        local_560 = (float)local_ee0;
        local_ee0._4_4_ = (float)((ulong)uVar19 >> 0x20);
        fStack_55c = local_ee0._4_4_;
        uStack_ed8._0_4_ = (float)uVar20;
        fStack_558 = (float)uStack_ed8;
        uStack_ed8._4_4_ = (float)((ulong)uVar20 >> 0x20);
        fStack_554 = uStack_ed8._4_4_;
        uStack_ed0._0_4_ = (float)uVar21;
        fStack_550 = (float)uStack_ed0;
        uStack_ed0._4_4_ = (float)((ulong)uVar21 >> 0x20);
        fStack_54c = uStack_ed0._4_4_;
        uStack_ec8._0_4_ = (float)uVar22;
        fStack_548 = (float)uStack_ec8;
        uStack_ec8._4_4_ = (float)((ulong)uVar22 >> 0x20);
        fStack_b84 = uStack_ec8._4_4_;
        local_580._0_4_ = (float)local_f00;
        local_580._4_4_ = (float)((ulong)local_f00 >> 0x20);
        uStack_578._0_4_ = (float)uStack_ef8;
        uStack_578._4_4_ = (float)((ulong)uStack_ef8 >> 0x20);
        uStack_570._0_4_ = (float)uStack_ef0;
        uStack_570._4_4_ = (float)((ulong)uStack_ef0 >> 0x20);
        uStack_568._0_4_ = (float)uStack_ee8;
        local_ba0 = (float)local_ee0 * (float)local_580;
        fStack_b9c = local_ee0._4_4_ * local_580._4_4_;
        fStack_b98 = (float)uStack_ed8 * (float)uStack_578;
        fStack_b94 = uStack_ed8._4_4_ * uStack_578._4_4_;
        fStack_b90 = (float)uStack_ed0 * (float)uStack_570;
        fStack_b8c = uStack_ed0._4_4_ * uStack_570._4_4_;
        fStack_b88 = (float)uStack_ec8 * (float)uStack_568;
        fVar103 = local_ba0 + fVar103;
        fVar105 = fStack_b9c + fVar105;
        fVar106 = fStack_b98 + fVar106;
        in_stack_ffffffffffffd62c = fStack_b94 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_b90 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_b8c + in_stack_ffffffffffffd634;
        fVar107 = fStack_b88 + fVar107;
        uStack_ec8._4_4_ = uStack_ec8._4_4_ + uStack_e68._4_4_;
        local_f80 = CONCAT44(fVar105,fVar103);
        uStack_f78 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_f70 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_f68 = CONCAT44(uStack_ec8._4_4_,fVar107);
        local_1700 = local_1978;
        local_f60 = *(undefined8 *)local_1978;
        uStack_f58 = *(undefined8 *)(local_1978 + 2);
        uStack_f50 = *(undefined8 *)(local_1978 + 4);
        uStack_f48 = *(undefined8 *)(local_1978 + 6);
        local_1708 = local_1978 + 8;
        local_fc0 = *(undefined8 *)local_1708;
        uStack_fb8 = *(undefined8 *)(local_1978 + 10);
        uStack_fb0 = *(undefined8 *)(local_1978 + 0xc);
        uStack_fa8 = *(undefined8 *)(local_1978 + 0xe);
        local_1710 = local_1978 + 0x10;
        local_1020 = *(undefined8 *)local_1710;
        uStack_1018 = *(undefined8 *)(local_1978 + 0x12);
        uStack_1010 = *(undefined8 *)(local_1978 + 0x14);
        uStack_1008 = *(undefined8 *)(local_1978 + 0x16);
        local_1718 = local_1978 + 0x18;
        local_1080 = *(undefined8 *)local_1718;
        uStack_1078 = *(undefined8 *)(local_1978 + 0x1a);
        uStack_1070 = *(undefined8 *)(local_1978 + 0x1c);
        uStack_1068 = *(undefined8 *)(local_1978 + 0x1e);
        local_1720 = local_1978 + 0x20;
        local_10e0 = *(undefined8 *)local_1720;
        uStack_10d8 = *(undefined8 *)(local_1978 + 0x22);
        uStack_10d0 = *(undefined8 *)(local_1978 + 0x24);
        uStack_10c8 = *(undefined8 *)(local_1978 + 0x26);
        uVar23 = *(undefined8 *)local_1728;
        uVar24 = *(undefined8 *)(local_1918 + 0x2a);
        uVar25 = *(undefined8 *)(local_1918 + 0x2c);
        uVar26 = *(undefined8 *)(local_1918 + 0x2e);
        local_1730 = local_1918 + 0x30;
        uVar27 = *(undefined8 *)local_1730;
        uVar28 = *(undefined8 *)(local_1918 + 0x32);
        uVar29 = *(undefined8 *)(local_1918 + 0x34);
        uVar30 = *(undefined8 *)(local_1918 + 0x36);
        local_1738 = local_1918 + 0x38;
        uVar31 = *(undefined8 *)local_1738;
        uVar32 = *(undefined8 *)(local_1918 + 0x3a);
        uVar33 = *(undefined8 *)(local_1918 + 0x3c);
        uVar34 = *(undefined8 *)(local_1918 + 0x3e);
        local_1740 = local_1918 + 0x40;
        uVar35 = *(undefined8 *)local_1740;
        uVar36 = *(undefined8 *)(local_1918 + 0x42);
        uVar37 = *(undefined8 *)(local_1918 + 0x44);
        uVar38 = *(undefined8 *)(local_1918 + 0x46);
        local_1748 = local_1918 + 0x48;
        uVar39 = *(undefined8 *)local_1748;
        uVar40 = *(undefined8 *)(local_1918 + 0x4a);
        uVar41 = *(undefined8 *)(local_1918 + 0x4c);
        uVar42 = *(undefined8 *)(local_1918 + 0x4e);
        local_1778 = local_1918 + 0x50;
        local_f40._0_4_ = (float)uVar23;
        local_520 = (float)local_f40;
        local_f40._4_4_ = (float)((ulong)uVar23 >> 0x20);
        fStack_51c = local_f40._4_4_;
        uStack_f38._0_4_ = (float)uVar24;
        fStack_518 = (float)uStack_f38;
        uStack_f38._4_4_ = (float)((ulong)uVar24 >> 0x20);
        fStack_514 = uStack_f38._4_4_;
        uStack_f30._0_4_ = (float)uVar25;
        fStack_510 = (float)uStack_f30;
        uStack_f30._4_4_ = (float)((ulong)uVar25 >> 0x20);
        fStack_50c = uStack_f30._4_4_;
        uStack_f28._0_4_ = (float)uVar26;
        fStack_508 = (float)uStack_f28;
        uStack_f28._4_4_ = (float)((ulong)uVar26 >> 0x20);
        fStack_b44 = uStack_f28._4_4_;
        local_540._0_4_ = (float)local_f60;
        local_540._4_4_ = (float)((ulong)local_f60 >> 0x20);
        uStack_538._0_4_ = (float)uStack_f58;
        uStack_538._4_4_ = (float)((ulong)uStack_f58 >> 0x20);
        uStack_530._0_4_ = (float)uStack_f50;
        uStack_530._4_4_ = (float)((ulong)uStack_f50 >> 0x20);
        uStack_528._0_4_ = (float)uStack_f48;
        local_b60 = (float)local_f40 * (float)local_540;
        fStack_b5c = local_f40._4_4_ * local_540._4_4_;
        fStack_b58 = (float)uStack_f38 * (float)uStack_538;
        fStack_b54 = uStack_f38._4_4_ * uStack_538._4_4_;
        fStack_b50 = (float)uStack_f30 * (float)uStack_530;
        fStack_b4c = uStack_f30._4_4_ * uStack_530._4_4_;
        fStack_b48 = (float)uStack_f28 * (float)uStack_528;
        fVar103 = local_b60 + fVar103;
        fVar105 = fStack_b5c + fVar105;
        fVar106 = fStack_b58 + fVar106;
        in_stack_ffffffffffffd62c = fStack_b54 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_b50 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_b4c + in_stack_ffffffffffffd634;
        fVar107 = fStack_b48 + fVar107;
        uStack_f28._4_4_ = uStack_f28._4_4_ + uStack_ec8._4_4_;
        local_fe0 = CONCAT44(fVar105,fVar103);
        uStack_fd8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_fd0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_fc8 = CONCAT44(uStack_f28._4_4_,fVar107);
        local_fa0._0_4_ = (float)uVar27;
        local_4e0 = (float)local_fa0;
        local_fa0._4_4_ = (float)((ulong)uVar27 >> 0x20);
        fStack_4dc = local_fa0._4_4_;
        uStack_f98._0_4_ = (float)uVar28;
        fStack_4d8 = (float)uStack_f98;
        uStack_f98._4_4_ = (float)((ulong)uVar28 >> 0x20);
        fStack_4d4 = uStack_f98._4_4_;
        uStack_f90._0_4_ = (float)uVar29;
        fStack_4d0 = (float)uStack_f90;
        uStack_f90._4_4_ = (float)((ulong)uVar29 >> 0x20);
        fStack_4cc = uStack_f90._4_4_;
        uStack_f88._0_4_ = (float)uVar30;
        fStack_4c8 = (float)uStack_f88;
        uStack_f88._4_4_ = (float)((ulong)uVar30 >> 0x20);
        fStack_b04 = uStack_f88._4_4_;
        local_500._0_4_ = (float)local_fc0;
        local_500._4_4_ = (float)((ulong)local_fc0 >> 0x20);
        uStack_4f8._0_4_ = (float)uStack_fb8;
        uStack_4f8._4_4_ = (float)((ulong)uStack_fb8 >> 0x20);
        uStack_4f0._0_4_ = (float)uStack_fb0;
        uStack_4f0._4_4_ = (float)((ulong)uStack_fb0 >> 0x20);
        uStack_4e8._0_4_ = (float)uStack_fa8;
        local_b20 = (float)local_fa0 * (float)local_500;
        fStack_b1c = local_fa0._4_4_ * local_500._4_4_;
        fStack_b18 = (float)uStack_f98 * (float)uStack_4f8;
        fStack_b14 = uStack_f98._4_4_ * uStack_4f8._4_4_;
        fStack_b10 = (float)uStack_f90 * (float)uStack_4f0;
        fStack_b0c = uStack_f90._4_4_ * uStack_4f0._4_4_;
        fStack_b08 = (float)uStack_f88 * (float)uStack_4e8;
        fVar103 = local_b20 + fVar103;
        fVar105 = fStack_b1c + fVar105;
        fVar106 = fStack_b18 + fVar106;
        in_stack_ffffffffffffd62c = fStack_b14 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_b10 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_b0c + in_stack_ffffffffffffd634;
        fVar107 = fStack_b08 + fVar107;
        uStack_f88._4_4_ = uStack_f88._4_4_ + uStack_f28._4_4_;
        local_1040 = CONCAT44(fVar105,fVar103);
        uStack_1038 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1030 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1028 = CONCAT44(uStack_f88._4_4_,fVar107);
        local_1000._0_4_ = (float)uVar31;
        local_4a0 = (float)local_1000;
        local_1000._4_4_ = (float)((ulong)uVar31 >> 0x20);
        fStack_49c = local_1000._4_4_;
        uStack_ff8._0_4_ = (float)uVar32;
        fStack_498 = (float)uStack_ff8;
        uStack_ff8._4_4_ = (float)((ulong)uVar32 >> 0x20);
        fStack_494 = uStack_ff8._4_4_;
        uStack_ff0._0_4_ = (float)uVar33;
        fStack_490 = (float)uStack_ff0;
        uStack_ff0._4_4_ = (float)((ulong)uVar33 >> 0x20);
        fStack_48c = uStack_ff0._4_4_;
        uStack_fe8._0_4_ = (float)uVar34;
        fStack_488 = (float)uStack_fe8;
        uStack_fe8._4_4_ = (float)((ulong)uVar34 >> 0x20);
        fStack_ac4 = uStack_fe8._4_4_;
        local_4c0._0_4_ = (float)local_1020;
        local_4c0._4_4_ = (float)((ulong)local_1020 >> 0x20);
        uStack_4b8._0_4_ = (float)uStack_1018;
        uStack_4b8._4_4_ = (float)((ulong)uStack_1018 >> 0x20);
        uStack_4b0._0_4_ = (float)uStack_1010;
        uStack_4b0._4_4_ = (float)((ulong)uStack_1010 >> 0x20);
        uStack_4a8._0_4_ = (float)uStack_1008;
        local_ae0 = (float)local_1000 * (float)local_4c0;
        fStack_adc = local_1000._4_4_ * local_4c0._4_4_;
        fStack_ad8 = (float)uStack_ff8 * (float)uStack_4b8;
        fStack_ad4 = uStack_ff8._4_4_ * uStack_4b8._4_4_;
        fStack_ad0 = (float)uStack_ff0 * (float)uStack_4b0;
        fStack_acc = uStack_ff0._4_4_ * uStack_4b0._4_4_;
        fStack_ac8 = (float)uStack_fe8 * (float)uStack_4a8;
        fVar103 = local_ae0 + fVar103;
        fVar105 = fStack_adc + fVar105;
        fVar106 = fStack_ad8 + fVar106;
        in_stack_ffffffffffffd62c = fStack_ad4 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_ad0 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_acc + in_stack_ffffffffffffd634;
        fVar107 = fStack_ac8 + fVar107;
        uStack_fe8._4_4_ = uStack_fe8._4_4_ + uStack_f88._4_4_;
        local_10a0 = CONCAT44(fVar105,fVar103);
        uStack_1098 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1090 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1088 = CONCAT44(uStack_fe8._4_4_,fVar107);
        local_1060._0_4_ = (float)uVar35;
        local_460 = (float)local_1060;
        local_1060._4_4_ = (float)((ulong)uVar35 >> 0x20);
        fStack_45c = local_1060._4_4_;
        uStack_1058._0_4_ = (float)uVar36;
        fStack_458 = (float)uStack_1058;
        uStack_1058._4_4_ = (float)((ulong)uVar36 >> 0x20);
        fStack_454 = uStack_1058._4_4_;
        uStack_1050._0_4_ = (float)uVar37;
        fStack_450 = (float)uStack_1050;
        uStack_1050._4_4_ = (float)((ulong)uVar37 >> 0x20);
        fStack_44c = uStack_1050._4_4_;
        uStack_1048._0_4_ = (float)uVar38;
        fStack_448 = (float)uStack_1048;
        uStack_1048._4_4_ = (float)((ulong)uVar38 >> 0x20);
        fStack_a84 = uStack_1048._4_4_;
        local_480._0_4_ = (float)local_1080;
        local_480._4_4_ = (float)((ulong)local_1080 >> 0x20);
        uStack_478._0_4_ = (float)uStack_1078;
        uStack_478._4_4_ = (float)((ulong)uStack_1078 >> 0x20);
        uStack_470._0_4_ = (float)uStack_1070;
        uStack_470._4_4_ = (float)((ulong)uStack_1070 >> 0x20);
        uStack_468._0_4_ = (float)uStack_1068;
        local_aa0 = (float)local_1060 * (float)local_480;
        fStack_a9c = local_1060._4_4_ * local_480._4_4_;
        fStack_a98 = (float)uStack_1058 * (float)uStack_478;
        fStack_a94 = uStack_1058._4_4_ * uStack_478._4_4_;
        fStack_a90 = (float)uStack_1050 * (float)uStack_470;
        fStack_a8c = uStack_1050._4_4_ * uStack_470._4_4_;
        fStack_a88 = (float)uStack_1048 * (float)uStack_468;
        fVar103 = local_aa0 + fVar103;
        fVar105 = fStack_a9c + fVar105;
        fVar106 = fStack_a98 + fVar106;
        in_stack_ffffffffffffd62c = fStack_a94 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_a90 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_a8c + in_stack_ffffffffffffd634;
        fVar107 = fStack_a88 + fVar107;
        uStack_1048._4_4_ = uStack_1048._4_4_ + uStack_fe8._4_4_;
        local_1100 = CONCAT44(fVar105,fVar103);
        uStack_10f8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_10f0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_10e8 = CONCAT44(uStack_1048._4_4_,fVar107);
        local_10c0._0_4_ = (float)uVar39;
        local_420 = (float)local_10c0;
        local_10c0._4_4_ = (float)((ulong)uVar39 >> 0x20);
        fStack_41c = local_10c0._4_4_;
        uStack_10b8._0_4_ = (float)uVar40;
        fStack_418 = (float)uStack_10b8;
        uStack_10b8._4_4_ = (float)((ulong)uVar40 >> 0x20);
        fStack_414 = uStack_10b8._4_4_;
        uStack_10b0._0_4_ = (float)uVar41;
        fStack_410 = (float)uStack_10b0;
        uStack_10b0._4_4_ = (float)((ulong)uVar41 >> 0x20);
        fStack_40c = uStack_10b0._4_4_;
        uStack_10a8._0_4_ = (float)uVar42;
        fStack_408 = (float)uStack_10a8;
        uStack_10a8._4_4_ = (float)((ulong)uVar42 >> 0x20);
        fStack_a44 = uStack_10a8._4_4_;
        local_440._0_4_ = (float)local_10e0;
        local_440._4_4_ = (float)((ulong)local_10e0 >> 0x20);
        uStack_438._0_4_ = (float)uStack_10d8;
        uStack_438._4_4_ = (float)((ulong)uStack_10d8 >> 0x20);
        uStack_430._0_4_ = (float)uStack_10d0;
        uStack_430._4_4_ = (float)((ulong)uStack_10d0 >> 0x20);
        uStack_428._0_4_ = (float)uStack_10c8;
        local_a60 = (float)local_10c0 * (float)local_440;
        fStack_a5c = local_10c0._4_4_ * local_440._4_4_;
        fStack_a58 = (float)uStack_10b8 * (float)uStack_438;
        fStack_a54 = uStack_10b8._4_4_ * uStack_438._4_4_;
        fStack_a50 = (float)uStack_10b0 * (float)uStack_430;
        fStack_a4c = uStack_10b0._4_4_ * uStack_430._4_4_;
        fStack_a48 = (float)uStack_10a8 * (float)uStack_428;
        fVar103 = local_a60 + fVar103;
        fVar105 = fStack_a5c + fVar105;
        fVar106 = fStack_a58 + fVar106;
        in_stack_ffffffffffffd62c = fStack_a54 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_a50 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_a4c + in_stack_ffffffffffffd634;
        fVar107 = fStack_a48 + fVar107;
        uStack_10a8._4_4_ = uStack_10a8._4_4_ + uStack_1048._4_4_;
        local_1160 = CONCAT44(fVar105,fVar103);
        uStack_1158 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1150 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1148 = CONCAT44(uStack_10a8._4_4_,fVar107);
        local_1750 = local_1980;
        local_1140 = *(undefined8 *)local_1980;
        uStack_1138 = *(undefined8 *)(local_1980 + 2);
        uStack_1130 = *(undefined8 *)(local_1980 + 4);
        uStack_1128 = *(undefined8 *)(local_1980 + 6);
        local_1758 = local_1980 + 8;
        local_11a0 = *(undefined8 *)local_1758;
        uStack_1198 = *(undefined8 *)(local_1980 + 10);
        uStack_1190 = *(undefined8 *)(local_1980 + 0xc);
        uStack_1188 = *(undefined8 *)(local_1980 + 0xe);
        local_1760 = local_1980 + 0x10;
        local_1200 = *(undefined8 *)local_1760;
        uStack_11f8 = *(undefined8 *)(local_1980 + 0x12);
        uStack_11f0 = *(undefined8 *)(local_1980 + 0x14);
        uStack_11e8 = *(undefined8 *)(local_1980 + 0x16);
        local_1768 = local_1980 + 0x18;
        local_1260 = *(undefined8 *)local_1768;
        uStack_1258 = *(undefined8 *)(local_1980 + 0x1a);
        uStack_1250 = *(undefined8 *)(local_1980 + 0x1c);
        uStack_1248 = *(undefined8 *)(local_1980 + 0x1e);
        local_1770 = local_1980 + 0x20;
        local_12c0 = *(undefined8 *)local_1770;
        uStack_12b8 = *(undefined8 *)(local_1980 + 0x22);
        uStack_12b0 = *(undefined8 *)(local_1980 + 0x24);
        uStack_12a8 = *(undefined8 *)(local_1980 + 0x26);
        uVar43 = *(undefined8 *)local_1778;
        uVar44 = *(undefined8 *)(local_1918 + 0x52);
        uVar45 = *(undefined8 *)(local_1918 + 0x54);
        uVar46 = *(undefined8 *)(local_1918 + 0x56);
        local_1780 = local_1918 + 0x58;
        uVar47 = *(undefined8 *)local_1780;
        uVar48 = *(undefined8 *)(local_1918 + 0x5a);
        uVar49 = *(undefined8 *)(local_1918 + 0x5c);
        uVar50 = *(undefined8 *)(local_1918 + 0x5e);
        local_1788 = local_1918 + 0x60;
        uVar51 = *(undefined8 *)local_1788;
        uVar52 = *(undefined8 *)(local_1918 + 0x62);
        uVar53 = *(undefined8 *)(local_1918 + 100);
        uVar54 = *(undefined8 *)(local_1918 + 0x66);
        local_1790 = local_1918 + 0x68;
        uVar55 = *(undefined8 *)local_1790;
        uVar56 = *(undefined8 *)(local_1918 + 0x6a);
        uVar57 = *(undefined8 *)(local_1918 + 0x6c);
        uVar58 = *(undefined8 *)(local_1918 + 0x6e);
        local_1798 = local_1918 + 0x70;
        uVar59 = *(undefined8 *)local_1798;
        uVar60 = *(undefined8 *)(local_1918 + 0x72);
        uVar61 = *(undefined8 *)(local_1918 + 0x74);
        uVar62 = *(undefined8 *)(local_1918 + 0x76);
        local_17c8 = local_1918 + 0x78;
        local_1120._0_4_ = (float)uVar43;
        local_3e0 = (float)local_1120;
        local_1120._4_4_ = (float)((ulong)uVar43 >> 0x20);
        fStack_3dc = local_1120._4_4_;
        uStack_1118._0_4_ = (float)uVar44;
        fStack_3d8 = (float)uStack_1118;
        uStack_1118._4_4_ = (float)((ulong)uVar44 >> 0x20);
        fStack_3d4 = uStack_1118._4_4_;
        uStack_1110._0_4_ = (float)uVar45;
        fStack_3d0 = (float)uStack_1110;
        uStack_1110._4_4_ = (float)((ulong)uVar45 >> 0x20);
        fStack_3cc = uStack_1110._4_4_;
        uStack_1108._0_4_ = (float)uVar46;
        fStack_3c8 = (float)uStack_1108;
        uStack_1108._4_4_ = (float)((ulong)uVar46 >> 0x20);
        fStack_a04 = uStack_1108._4_4_;
        local_400._0_4_ = (float)local_1140;
        local_400._4_4_ = (float)((ulong)local_1140 >> 0x20);
        uStack_3f8._0_4_ = (float)uStack_1138;
        uStack_3f8._4_4_ = (float)((ulong)uStack_1138 >> 0x20);
        uStack_3f0._0_4_ = (float)uStack_1130;
        uStack_3f0._4_4_ = (float)((ulong)uStack_1130 >> 0x20);
        uStack_3e8._0_4_ = (float)uStack_1128;
        local_a20 = (float)local_1120 * (float)local_400;
        fStack_a1c = local_1120._4_4_ * local_400._4_4_;
        fStack_a18 = (float)uStack_1118 * (float)uStack_3f8;
        fStack_a14 = uStack_1118._4_4_ * uStack_3f8._4_4_;
        fStack_a10 = (float)uStack_1110 * (float)uStack_3f0;
        fStack_a0c = uStack_1110._4_4_ * uStack_3f0._4_4_;
        fStack_a08 = (float)uStack_1108 * (float)uStack_3e8;
        fVar103 = local_a20 + fVar103;
        fVar105 = fStack_a1c + fVar105;
        fVar106 = fStack_a18 + fVar106;
        in_stack_ffffffffffffd62c = fStack_a14 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_a10 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_a0c + in_stack_ffffffffffffd634;
        fVar107 = fStack_a08 + fVar107;
        uStack_1108._4_4_ = uStack_1108._4_4_ + uStack_10a8._4_4_;
        local_11c0 = CONCAT44(fVar105,fVar103);
        uStack_11b8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_11b0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_11a8 = CONCAT44(uStack_1108._4_4_,fVar107);
        local_1180._0_4_ = (float)uVar47;
        local_3a0 = (float)local_1180;
        local_1180._4_4_ = (float)((ulong)uVar47 >> 0x20);
        fStack_39c = local_1180._4_4_;
        uStack_1178._0_4_ = (float)uVar48;
        fStack_398 = (float)uStack_1178;
        uStack_1178._4_4_ = (float)((ulong)uVar48 >> 0x20);
        fStack_394 = uStack_1178._4_4_;
        uStack_1170._0_4_ = (float)uVar49;
        fStack_390 = (float)uStack_1170;
        uStack_1170._4_4_ = (float)((ulong)uVar49 >> 0x20);
        fStack_38c = uStack_1170._4_4_;
        uStack_1168._0_4_ = (float)uVar50;
        fStack_388 = (float)uStack_1168;
        uStack_1168._4_4_ = (float)((ulong)uVar50 >> 0x20);
        fStack_9c4 = uStack_1168._4_4_;
        local_3c0._0_4_ = (float)local_11a0;
        local_3c0._4_4_ = (float)((ulong)local_11a0 >> 0x20);
        uStack_3b8._0_4_ = (float)uStack_1198;
        uStack_3b8._4_4_ = (float)((ulong)uStack_1198 >> 0x20);
        uStack_3b0._0_4_ = (float)uStack_1190;
        uStack_3b0._4_4_ = (float)((ulong)uStack_1190 >> 0x20);
        uStack_3a8._0_4_ = (float)uStack_1188;
        local_9e0 = (float)local_1180 * (float)local_3c0;
        fStack_9dc = local_1180._4_4_ * local_3c0._4_4_;
        fStack_9d8 = (float)uStack_1178 * (float)uStack_3b8;
        fStack_9d4 = uStack_1178._4_4_ * uStack_3b8._4_4_;
        fStack_9d0 = (float)uStack_1170 * (float)uStack_3b0;
        fStack_9cc = uStack_1170._4_4_ * uStack_3b0._4_4_;
        fStack_9c8 = (float)uStack_1168 * (float)uStack_3a8;
        fVar103 = local_9e0 + fVar103;
        fVar105 = fStack_9dc + fVar105;
        fVar106 = fStack_9d8 + fVar106;
        in_stack_ffffffffffffd62c = fStack_9d4 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_9d0 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_9cc + in_stack_ffffffffffffd634;
        fVar107 = fStack_9c8 + fVar107;
        uStack_1168._4_4_ = uStack_1168._4_4_ + uStack_1108._4_4_;
        local_1220 = CONCAT44(fVar105,fVar103);
        uStack_1218 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1210 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1208 = CONCAT44(uStack_1168._4_4_,fVar107);
        local_11e0._0_4_ = (float)uVar51;
        local_360 = (float)local_11e0;
        local_11e0._4_4_ = (float)((ulong)uVar51 >> 0x20);
        fStack_35c = local_11e0._4_4_;
        uStack_11d8._0_4_ = (float)uVar52;
        fStack_358 = (float)uStack_11d8;
        uStack_11d8._4_4_ = (float)((ulong)uVar52 >> 0x20);
        fStack_354 = uStack_11d8._4_4_;
        uStack_11d0._0_4_ = (float)uVar53;
        fStack_350 = (float)uStack_11d0;
        uStack_11d0._4_4_ = (float)((ulong)uVar53 >> 0x20);
        fStack_34c = uStack_11d0._4_4_;
        uStack_11c8._0_4_ = (float)uVar54;
        fStack_348 = (float)uStack_11c8;
        uStack_11c8._4_4_ = (float)((ulong)uVar54 >> 0x20);
        fStack_984 = uStack_11c8._4_4_;
        local_380._0_4_ = (float)local_1200;
        local_380._4_4_ = (float)((ulong)local_1200 >> 0x20);
        uStack_378._0_4_ = (float)uStack_11f8;
        uStack_378._4_4_ = (float)((ulong)uStack_11f8 >> 0x20);
        uStack_370._0_4_ = (float)uStack_11f0;
        uStack_370._4_4_ = (float)((ulong)uStack_11f0 >> 0x20);
        uStack_368._0_4_ = (float)uStack_11e8;
        local_9a0 = (float)local_11e0 * (float)local_380;
        fStack_99c = local_11e0._4_4_ * local_380._4_4_;
        fStack_998 = (float)uStack_11d8 * (float)uStack_378;
        fStack_994 = uStack_11d8._4_4_ * uStack_378._4_4_;
        fStack_990 = (float)uStack_11d0 * (float)uStack_370;
        fStack_98c = uStack_11d0._4_4_ * uStack_370._4_4_;
        fStack_988 = (float)uStack_11c8 * (float)uStack_368;
        fVar103 = local_9a0 + fVar103;
        fVar105 = fStack_99c + fVar105;
        fVar106 = fStack_998 + fVar106;
        in_stack_ffffffffffffd62c = fStack_994 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_990 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_98c + in_stack_ffffffffffffd634;
        fVar107 = fStack_988 + fVar107;
        uStack_11c8._4_4_ = uStack_11c8._4_4_ + uStack_1168._4_4_;
        local_1280 = CONCAT44(fVar105,fVar103);
        uStack_1278 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1270 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1268 = CONCAT44(uStack_11c8._4_4_,fVar107);
        local_1240._0_4_ = (float)uVar55;
        local_320 = (float)local_1240;
        local_1240._4_4_ = (float)((ulong)uVar55 >> 0x20);
        fStack_31c = local_1240._4_4_;
        uStack_1238._0_4_ = (float)uVar56;
        fStack_318 = (float)uStack_1238;
        uStack_1238._4_4_ = (float)((ulong)uVar56 >> 0x20);
        fStack_314 = uStack_1238._4_4_;
        uStack_1230._0_4_ = (float)uVar57;
        fStack_310 = (float)uStack_1230;
        uStack_1230._4_4_ = (float)((ulong)uVar57 >> 0x20);
        fStack_30c = uStack_1230._4_4_;
        uStack_1228._0_4_ = (float)uVar58;
        fStack_308 = (float)uStack_1228;
        uStack_1228._4_4_ = (float)((ulong)uVar58 >> 0x20);
        fStack_944 = uStack_1228._4_4_;
        local_340._0_4_ = (float)local_1260;
        local_340._4_4_ = (float)((ulong)local_1260 >> 0x20);
        uStack_338._0_4_ = (float)uStack_1258;
        uStack_338._4_4_ = (float)((ulong)uStack_1258 >> 0x20);
        uStack_330._0_4_ = (float)uStack_1250;
        uStack_330._4_4_ = (float)((ulong)uStack_1250 >> 0x20);
        uStack_328._0_4_ = (float)uStack_1248;
        local_960 = (float)local_1240 * (float)local_340;
        fStack_95c = local_1240._4_4_ * local_340._4_4_;
        fStack_958 = (float)uStack_1238 * (float)uStack_338;
        fStack_954 = uStack_1238._4_4_ * uStack_338._4_4_;
        fStack_950 = (float)uStack_1230 * (float)uStack_330;
        fStack_94c = uStack_1230._4_4_ * uStack_330._4_4_;
        fStack_948 = (float)uStack_1228 * (float)uStack_328;
        fVar103 = local_960 + fVar103;
        fVar105 = fStack_95c + fVar105;
        fVar106 = fStack_958 + fVar106;
        in_stack_ffffffffffffd62c = fStack_954 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_950 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_94c + in_stack_ffffffffffffd634;
        fVar107 = fStack_948 + fVar107;
        uStack_1228._4_4_ = uStack_1228._4_4_ + uStack_11c8._4_4_;
        local_12e0 = CONCAT44(fVar105,fVar103);
        uStack_12d8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_12d0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_12c8 = CONCAT44(uStack_1228._4_4_,fVar107);
        local_12a0._0_4_ = (float)uVar59;
        local_2e0 = (float)local_12a0;
        local_12a0._4_4_ = (float)((ulong)uVar59 >> 0x20);
        fStack_2dc = local_12a0._4_4_;
        uStack_1298._0_4_ = (float)uVar60;
        fStack_2d8 = (float)uStack_1298;
        uStack_1298._4_4_ = (float)((ulong)uVar60 >> 0x20);
        fStack_2d4 = uStack_1298._4_4_;
        uStack_1290._0_4_ = (float)uVar61;
        fStack_2d0 = (float)uStack_1290;
        uStack_1290._4_4_ = (float)((ulong)uVar61 >> 0x20);
        fStack_2cc = uStack_1290._4_4_;
        uStack_1288._0_4_ = (float)uVar62;
        fStack_2c8 = (float)uStack_1288;
        uStack_1288._4_4_ = (float)((ulong)uVar62 >> 0x20);
        fStack_904 = uStack_1288._4_4_;
        local_300._0_4_ = (float)local_12c0;
        local_300._4_4_ = (float)((ulong)local_12c0 >> 0x20);
        uStack_2f8._0_4_ = (float)uStack_12b8;
        uStack_2f8._4_4_ = (float)((ulong)uStack_12b8 >> 0x20);
        uStack_2f0._0_4_ = (float)uStack_12b0;
        uStack_2f0._4_4_ = (float)((ulong)uStack_12b0 >> 0x20);
        uStack_2e8._0_4_ = (float)uStack_12a8;
        local_920 = (float)local_12a0 * (float)local_300;
        fStack_91c = local_12a0._4_4_ * local_300._4_4_;
        fStack_918 = (float)uStack_1298 * (float)uStack_2f8;
        fStack_914 = uStack_1298._4_4_ * uStack_2f8._4_4_;
        fStack_910 = (float)uStack_1290 * (float)uStack_2f0;
        fStack_90c = uStack_1290._4_4_ * uStack_2f0._4_4_;
        fStack_908 = (float)uStack_1288 * (float)uStack_2e8;
        fVar103 = local_920 + fVar103;
        fVar105 = fStack_91c + fVar105;
        fVar106 = fStack_918 + fVar106;
        in_stack_ffffffffffffd62c = fStack_914 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_910 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_90c + in_stack_ffffffffffffd634;
        fVar107 = fStack_908 + fVar107;
        uStack_1288._4_4_ = uStack_1288._4_4_ + uStack_1228._4_4_;
        local_1340 = CONCAT44(fVar105,fVar103);
        uStack_1338 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1330 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1328 = CONCAT44(uStack_1288._4_4_,fVar107);
        local_17a0 = local_1988;
        local_1320 = *(undefined8 *)local_1988;
        uStack_1318 = *(undefined8 *)(local_1988 + 2);
        uStack_1310 = *(undefined8 *)(local_1988 + 4);
        uStack_1308 = *(undefined8 *)(local_1988 + 6);
        local_17a8 = local_1988 + 8;
        local_1380 = *(undefined8 *)local_17a8;
        uStack_1378 = *(undefined8 *)(local_1988 + 10);
        uStack_1370 = *(undefined8 *)(local_1988 + 0xc);
        uStack_1368 = *(undefined8 *)(local_1988 + 0xe);
        local_17b0 = local_1988 + 0x10;
        local_13e0 = *(undefined8 *)local_17b0;
        uStack_13d8 = *(undefined8 *)(local_1988 + 0x12);
        uStack_13d0 = *(undefined8 *)(local_1988 + 0x14);
        uStack_13c8 = *(undefined8 *)(local_1988 + 0x16);
        local_17b8 = local_1988 + 0x18;
        local_1440 = *(undefined8 *)local_17b8;
        uStack_1438 = *(undefined8 *)(local_1988 + 0x1a);
        uStack_1430 = *(undefined8 *)(local_1988 + 0x1c);
        uStack_1428 = *(undefined8 *)(local_1988 + 0x1e);
        local_17c0 = local_1988 + 0x20;
        local_14a0 = *(undefined8 *)local_17c0;
        uStack_1498 = *(undefined8 *)(local_1988 + 0x22);
        uStack_1490 = *(undefined8 *)(local_1988 + 0x24);
        uStack_1488 = *(undefined8 *)(local_1988 + 0x26);
        uVar63 = *(undefined8 *)local_17c8;
        uVar64 = *(undefined8 *)(local_1918 + 0x7a);
        uVar65 = *(undefined8 *)(local_1918 + 0x7c);
        uVar66 = *(undefined8 *)(local_1918 + 0x7e);
        local_17d0 = local_1918 + 0x80;
        uVar67 = *(undefined8 *)local_17d0;
        uVar68 = *(undefined8 *)(local_1918 + 0x82);
        uVar69 = *(undefined8 *)(local_1918 + 0x84);
        uVar70 = *(undefined8 *)(local_1918 + 0x86);
        local_17d8 = local_1918 + 0x88;
        uVar71 = *(undefined8 *)local_17d8;
        uVar72 = *(undefined8 *)(local_1918 + 0x8a);
        uVar73 = *(undefined8 *)(local_1918 + 0x8c);
        uVar74 = *(undefined8 *)(local_1918 + 0x8e);
        local_17e0 = local_1918 + 0x90;
        uVar75 = *(undefined8 *)local_17e0;
        uVar76 = *(undefined8 *)(local_1918 + 0x92);
        uVar77 = *(undefined8 *)(local_1918 + 0x94);
        uVar78 = *(undefined8 *)(local_1918 + 0x96);
        local_17e8 = local_1918 + 0x98;
        uVar79 = *(undefined8 *)local_17e8;
        uVar80 = *(undefined8 *)(local_1918 + 0x9a);
        uVar81 = *(undefined8 *)(local_1918 + 0x9c);
        uVar82 = *(undefined8 *)(local_1918 + 0x9e);
        local_1818 = local_1918 + 0xa0;
        local_1300._0_4_ = (float)uVar63;
        local_2a0 = (float)local_1300;
        local_1300._4_4_ = (float)((ulong)uVar63 >> 0x20);
        fStack_29c = local_1300._4_4_;
        uStack_12f8._0_4_ = (float)uVar64;
        fStack_298 = (float)uStack_12f8;
        uStack_12f8._4_4_ = (float)((ulong)uVar64 >> 0x20);
        fStack_294 = uStack_12f8._4_4_;
        uStack_12f0._0_4_ = (float)uVar65;
        fStack_290 = (float)uStack_12f0;
        uStack_12f0._4_4_ = (float)((ulong)uVar65 >> 0x20);
        fStack_28c = uStack_12f0._4_4_;
        uStack_12e8._0_4_ = (float)uVar66;
        fStack_288 = (float)uStack_12e8;
        uStack_12e8._4_4_ = (float)((ulong)uVar66 >> 0x20);
        fStack_8c4 = uStack_12e8._4_4_;
        local_2c0._0_4_ = (float)local_1320;
        local_2c0._4_4_ = (float)((ulong)local_1320 >> 0x20);
        uStack_2b8._0_4_ = (float)uStack_1318;
        uStack_2b8._4_4_ = (float)((ulong)uStack_1318 >> 0x20);
        uStack_2b0._0_4_ = (float)uStack_1310;
        uStack_2b0._4_4_ = (float)((ulong)uStack_1310 >> 0x20);
        uStack_2a8._0_4_ = (float)uStack_1308;
        local_8e0 = (float)local_1300 * (float)local_2c0;
        fStack_8dc = local_1300._4_4_ * local_2c0._4_4_;
        fStack_8d8 = (float)uStack_12f8 * (float)uStack_2b8;
        fStack_8d4 = uStack_12f8._4_4_ * uStack_2b8._4_4_;
        fStack_8d0 = (float)uStack_12f0 * (float)uStack_2b0;
        fStack_8cc = uStack_12f0._4_4_ * uStack_2b0._4_4_;
        fStack_8c8 = (float)uStack_12e8 * (float)uStack_2a8;
        fVar103 = local_8e0 + fVar103;
        fVar105 = fStack_8dc + fVar105;
        fVar106 = fStack_8d8 + fVar106;
        in_stack_ffffffffffffd62c = fStack_8d4 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_8d0 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_8cc + in_stack_ffffffffffffd634;
        fVar107 = fStack_8c8 + fVar107;
        uStack_12e8._4_4_ = uStack_12e8._4_4_ + uStack_1288._4_4_;
        local_13a0 = CONCAT44(fVar105,fVar103);
        uStack_1398 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1390 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1388 = CONCAT44(uStack_12e8._4_4_,fVar107);
        local_1360._0_4_ = (float)uVar67;
        local_260 = (float)local_1360;
        local_1360._4_4_ = (float)((ulong)uVar67 >> 0x20);
        fStack_25c = local_1360._4_4_;
        uStack_1358._0_4_ = (float)uVar68;
        fStack_258 = (float)uStack_1358;
        uStack_1358._4_4_ = (float)((ulong)uVar68 >> 0x20);
        fStack_254 = uStack_1358._4_4_;
        uStack_1350._0_4_ = (float)uVar69;
        fStack_250 = (float)uStack_1350;
        uStack_1350._4_4_ = (float)((ulong)uVar69 >> 0x20);
        fStack_24c = uStack_1350._4_4_;
        uStack_1348._0_4_ = (float)uVar70;
        fStack_248 = (float)uStack_1348;
        uStack_1348._4_4_ = (float)((ulong)uVar70 >> 0x20);
        fStack_884 = uStack_1348._4_4_;
        local_280._0_4_ = (float)local_1380;
        local_280._4_4_ = (float)((ulong)local_1380 >> 0x20);
        uStack_278._0_4_ = (float)uStack_1378;
        uStack_278._4_4_ = (float)((ulong)uStack_1378 >> 0x20);
        uStack_270._0_4_ = (float)uStack_1370;
        uStack_270._4_4_ = (float)((ulong)uStack_1370 >> 0x20);
        uStack_268._0_4_ = (float)uStack_1368;
        local_8a0 = (float)local_1360 * (float)local_280;
        fStack_89c = local_1360._4_4_ * local_280._4_4_;
        fStack_898 = (float)uStack_1358 * (float)uStack_278;
        fStack_894 = uStack_1358._4_4_ * uStack_278._4_4_;
        fStack_890 = (float)uStack_1350 * (float)uStack_270;
        fStack_88c = uStack_1350._4_4_ * uStack_270._4_4_;
        fStack_888 = (float)uStack_1348 * (float)uStack_268;
        fVar103 = local_8a0 + fVar103;
        fVar105 = fStack_89c + fVar105;
        fVar106 = fStack_898 + fVar106;
        in_stack_ffffffffffffd62c = fStack_894 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_890 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_88c + in_stack_ffffffffffffd634;
        fVar107 = fStack_888 + fVar107;
        uStack_1348._4_4_ = uStack_1348._4_4_ + uStack_12e8._4_4_;
        local_1400 = CONCAT44(fVar105,fVar103);
        uStack_13f8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_13f0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_13e8 = CONCAT44(uStack_1348._4_4_,fVar107);
        local_13c0._0_4_ = (float)uVar71;
        local_220 = (float)local_13c0;
        local_13c0._4_4_ = (float)((ulong)uVar71 >> 0x20);
        fStack_21c = local_13c0._4_4_;
        uStack_13b8._0_4_ = (float)uVar72;
        fStack_218 = (float)uStack_13b8;
        uStack_13b8._4_4_ = (float)((ulong)uVar72 >> 0x20);
        fStack_214 = uStack_13b8._4_4_;
        uStack_13b0._0_4_ = (float)uVar73;
        fStack_210 = (float)uStack_13b0;
        uStack_13b0._4_4_ = (float)((ulong)uVar73 >> 0x20);
        fStack_20c = uStack_13b0._4_4_;
        uStack_13a8._0_4_ = (float)uVar74;
        fStack_208 = (float)uStack_13a8;
        uStack_13a8._4_4_ = (float)((ulong)uVar74 >> 0x20);
        fStack_844 = uStack_13a8._4_4_;
        local_240._0_4_ = (float)local_13e0;
        local_240._4_4_ = (float)((ulong)local_13e0 >> 0x20);
        uStack_238._0_4_ = (float)uStack_13d8;
        uStack_238._4_4_ = (float)((ulong)uStack_13d8 >> 0x20);
        uStack_230._0_4_ = (float)uStack_13d0;
        uStack_230._4_4_ = (float)((ulong)uStack_13d0 >> 0x20);
        uStack_228._0_4_ = (float)uStack_13c8;
        local_860 = (float)local_13c0 * (float)local_240;
        fStack_85c = local_13c0._4_4_ * local_240._4_4_;
        fStack_858 = (float)uStack_13b8 * (float)uStack_238;
        fStack_854 = uStack_13b8._4_4_ * uStack_238._4_4_;
        fStack_850 = (float)uStack_13b0 * (float)uStack_230;
        fStack_84c = uStack_13b0._4_4_ * uStack_230._4_4_;
        fStack_848 = (float)uStack_13a8 * (float)uStack_228;
        fVar103 = local_860 + fVar103;
        fVar105 = fStack_85c + fVar105;
        fVar106 = fStack_858 + fVar106;
        in_stack_ffffffffffffd62c = fStack_854 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_850 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_84c + in_stack_ffffffffffffd634;
        fVar107 = fStack_848 + fVar107;
        uStack_13a8._4_4_ = uStack_13a8._4_4_ + uStack_1348._4_4_;
        local_1460 = CONCAT44(fVar105,fVar103);
        uStack_1458 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1450 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1448 = CONCAT44(uStack_13a8._4_4_,fVar107);
        local_1420._0_4_ = (float)uVar75;
        local_1e0 = (float)local_1420;
        local_1420._4_4_ = (float)((ulong)uVar75 >> 0x20);
        fStack_1dc = local_1420._4_4_;
        uStack_1418._0_4_ = (float)uVar76;
        fStack_1d8 = (float)uStack_1418;
        uStack_1418._4_4_ = (float)((ulong)uVar76 >> 0x20);
        fStack_1d4 = uStack_1418._4_4_;
        uStack_1410._0_4_ = (float)uVar77;
        fStack_1d0 = (float)uStack_1410;
        uStack_1410._4_4_ = (float)((ulong)uVar77 >> 0x20);
        fStack_1cc = uStack_1410._4_4_;
        uStack_1408._0_4_ = (float)uVar78;
        fStack_1c8 = (float)uStack_1408;
        uStack_1408._4_4_ = (float)((ulong)uVar78 >> 0x20);
        fStack_804 = uStack_1408._4_4_;
        local_200._0_4_ = (float)local_1440;
        local_200._4_4_ = (float)((ulong)local_1440 >> 0x20);
        uStack_1f8._0_4_ = (float)uStack_1438;
        uStack_1f8._4_4_ = (float)((ulong)uStack_1438 >> 0x20);
        uStack_1f0._0_4_ = (float)uStack_1430;
        uStack_1f0._4_4_ = (float)((ulong)uStack_1430 >> 0x20);
        uStack_1e8._0_4_ = (float)uStack_1428;
        local_820 = (float)local_1420 * (float)local_200;
        fStack_81c = local_1420._4_4_ * local_200._4_4_;
        fStack_818 = (float)uStack_1418 * (float)uStack_1f8;
        fStack_814 = uStack_1418._4_4_ * uStack_1f8._4_4_;
        fStack_810 = (float)uStack_1410 * (float)uStack_1f0;
        fStack_80c = uStack_1410._4_4_ * uStack_1f0._4_4_;
        fStack_808 = (float)uStack_1408 * (float)uStack_1e8;
        fVar103 = local_820 + fVar103;
        fVar105 = fStack_81c + fVar105;
        fVar106 = fStack_818 + fVar106;
        in_stack_ffffffffffffd62c = fStack_814 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_810 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_80c + in_stack_ffffffffffffd634;
        fVar107 = fStack_808 + fVar107;
        uStack_1408._4_4_ = uStack_1408._4_4_ + uStack_13a8._4_4_;
        local_14c0 = CONCAT44(fVar105,fVar103);
        uStack_14b8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_14b0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_14a8 = CONCAT44(uStack_1408._4_4_,fVar107);
        local_1480._0_4_ = (float)uVar79;
        local_1a0 = (float)local_1480;
        local_1480._4_4_ = (float)((ulong)uVar79 >> 0x20);
        fStack_19c = local_1480._4_4_;
        uStack_1478._0_4_ = (float)uVar80;
        fStack_198 = (float)uStack_1478;
        uStack_1478._4_4_ = (float)((ulong)uVar80 >> 0x20);
        fStack_194 = uStack_1478._4_4_;
        uStack_1470._0_4_ = (float)uVar81;
        fStack_190 = (float)uStack_1470;
        uStack_1470._4_4_ = (float)((ulong)uVar81 >> 0x20);
        fStack_18c = uStack_1470._4_4_;
        uStack_1468._0_4_ = (float)uVar82;
        fStack_188 = (float)uStack_1468;
        uStack_1468._4_4_ = (float)((ulong)uVar82 >> 0x20);
        fStack_7c4 = uStack_1468._4_4_;
        local_1c0._0_4_ = (float)local_14a0;
        local_1c0._4_4_ = (float)((ulong)local_14a0 >> 0x20);
        uStack_1b8._0_4_ = (float)uStack_1498;
        uStack_1b8._4_4_ = (float)((ulong)uStack_1498 >> 0x20);
        uStack_1b0._0_4_ = (float)uStack_1490;
        uStack_1b0._4_4_ = (float)((ulong)uStack_1490 >> 0x20);
        uStack_1a8._0_4_ = (float)uStack_1488;
        local_7e0 = (float)local_1480 * (float)local_1c0;
        fStack_7dc = local_1480._4_4_ * local_1c0._4_4_;
        fStack_7d8 = (float)uStack_1478 * (float)uStack_1b8;
        fStack_7d4 = uStack_1478._4_4_ * uStack_1b8._4_4_;
        fStack_7d0 = (float)uStack_1470 * (float)uStack_1b0;
        fStack_7cc = uStack_1470._4_4_ * uStack_1b0._4_4_;
        fStack_7c8 = (float)uStack_1468 * (float)uStack_1a8;
        fVar103 = local_7e0 + fVar103;
        fVar105 = fStack_7dc + fVar105;
        fVar106 = fStack_7d8 + fVar106;
        in_stack_ffffffffffffd62c = fStack_7d4 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_7d0 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_7cc + in_stack_ffffffffffffd634;
        fVar107 = fStack_7c8 + fVar107;
        uStack_1468._4_4_ = uStack_1468._4_4_ + uStack_1408._4_4_;
        local_1520 = CONCAT44(fVar105,fVar103);
        uStack_1518 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1510 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1508 = CONCAT44(uStack_1468._4_4_,fVar107);
        local_17f0 = local_1990;
        local_1500 = *(undefined8 *)local_1990;
        uStack_14f8 = *(undefined8 *)(local_1990 + 2);
        uStack_14f0 = *(undefined8 *)(local_1990 + 4);
        uStack_14e8 = *(undefined8 *)(local_1990 + 6);
        local_17f8 = local_1990 + 8;
        local_1560 = *(undefined8 *)local_17f8;
        uStack_1558 = *(undefined8 *)(local_1990 + 10);
        uStack_1550 = *(undefined8 *)(local_1990 + 0xc);
        uStack_1548 = *(undefined8 *)(local_1990 + 0xe);
        local_1800 = local_1990 + 0x10;
        local_15c0 = *(undefined8 *)local_1800;
        uStack_15b8 = *(undefined8 *)(local_1990 + 0x12);
        uStack_15b0 = *(undefined8 *)(local_1990 + 0x14);
        uStack_15a8 = *(undefined8 *)(local_1990 + 0x16);
        local_1808 = local_1990 + 0x18;
        local_1620 = *(undefined8 *)local_1808;
        uStack_1618 = *(undefined8 *)(local_1990 + 0x1a);
        uStack_1610 = *(undefined8 *)(local_1990 + 0x1c);
        uStack_1608 = *(undefined8 *)(local_1990 + 0x1e);
        local_1810 = local_1990 + 0x20;
        local_1680 = *(undefined8 *)local_1810;
        uStack_1678 = *(undefined8 *)(local_1990 + 0x22);
        uStack_1670 = *(undefined8 *)(local_1990 + 0x24);
        uStack_1668 = *(undefined8 *)(local_1990 + 0x26);
        uVar83 = *(undefined8 *)local_1818;
        uVar84 = *(undefined8 *)(local_1918 + 0xa2);
        uVar85 = *(undefined8 *)(local_1918 + 0xa4);
        uVar86 = *(undefined8 *)(local_1918 + 0xa6);
        local_1820 = local_1918 + 0xa8;
        uVar87 = *(undefined8 *)local_1820;
        uVar88 = *(undefined8 *)(local_1918 + 0xaa);
        uVar89 = *(undefined8 *)(local_1918 + 0xac);
        uVar90 = *(undefined8 *)(local_1918 + 0xae);
        local_1828 = local_1918 + 0xb0;
        uVar91 = *(undefined8 *)local_1828;
        uVar92 = *(undefined8 *)(local_1918 + 0xb2);
        uVar93 = *(undefined8 *)(local_1918 + 0xb4);
        uVar94 = *(undefined8 *)(local_1918 + 0xb6);
        local_1830 = local_1918 + 0xb8;
        uVar95 = *(undefined8 *)local_1830;
        uVar96 = *(undefined8 *)(local_1918 + 0xba);
        uVar97 = *(undefined8 *)(local_1918 + 0xbc);
        uVar98 = *(undefined8 *)(local_1918 + 0xbe);
        local_1838 = local_1918 + 0xc0;
        uVar99 = *(undefined8 *)local_1838;
        uVar100 = *(undefined8 *)(local_1918 + 0xc2);
        uVar101 = *(undefined8 *)(local_1918 + 0xc4);
        uVar102 = *(undefined8 *)(local_1918 + 0xc6);
        local_14e0._0_4_ = (float)uVar83;
        local_160 = (float)local_14e0;
        local_14e0._4_4_ = (float)((ulong)uVar83 >> 0x20);
        fStack_15c = local_14e0._4_4_;
        uStack_14d8._0_4_ = (float)uVar84;
        fStack_158 = (float)uStack_14d8;
        uStack_14d8._4_4_ = (float)((ulong)uVar84 >> 0x20);
        fStack_154 = uStack_14d8._4_4_;
        uStack_14d0._0_4_ = (float)uVar85;
        fStack_150 = (float)uStack_14d0;
        uStack_14d0._4_4_ = (float)((ulong)uVar85 >> 0x20);
        fStack_14c = uStack_14d0._4_4_;
        uStack_14c8._0_4_ = (float)uVar86;
        fStack_148 = (float)uStack_14c8;
        uStack_14c8._4_4_ = (float)((ulong)uVar86 >> 0x20);
        fStack_784 = uStack_14c8._4_4_;
        local_180._0_4_ = (float)local_1500;
        local_180._4_4_ = (float)((ulong)local_1500 >> 0x20);
        uStack_178._0_4_ = (float)uStack_14f8;
        uStack_178._4_4_ = (float)((ulong)uStack_14f8 >> 0x20);
        uStack_170._0_4_ = (float)uStack_14f0;
        uStack_170._4_4_ = (float)((ulong)uStack_14f0 >> 0x20);
        uStack_168._0_4_ = (float)uStack_14e8;
        local_7a0 = (float)local_14e0 * (float)local_180;
        fStack_79c = local_14e0._4_4_ * local_180._4_4_;
        fStack_798 = (float)uStack_14d8 * (float)uStack_178;
        fStack_794 = uStack_14d8._4_4_ * uStack_178._4_4_;
        fStack_790 = (float)uStack_14d0 * (float)uStack_170;
        fStack_78c = uStack_14d0._4_4_ * uStack_170._4_4_;
        fStack_788 = (float)uStack_14c8 * (float)uStack_168;
        fVar103 = local_7a0 + fVar103;
        fVar105 = fStack_79c + fVar105;
        fVar106 = fStack_798 + fVar106;
        in_stack_ffffffffffffd62c = fStack_794 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_790 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_78c + in_stack_ffffffffffffd634;
        fVar107 = fStack_788 + fVar107;
        uStack_14c8._4_4_ = uStack_14c8._4_4_ + uStack_1468._4_4_;
        local_1580 = CONCAT44(fVar105,fVar103);
        uStack_1578 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1570 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1568 = CONCAT44(uStack_14c8._4_4_,fVar107);
        local_1540._0_4_ = (float)uVar87;
        local_120 = (float)local_1540;
        local_1540._4_4_ = (float)((ulong)uVar87 >> 0x20);
        fStack_11c = local_1540._4_4_;
        uStack_1538._0_4_ = (float)uVar88;
        fStack_118 = (float)uStack_1538;
        uStack_1538._4_4_ = (float)((ulong)uVar88 >> 0x20);
        fStack_114 = uStack_1538._4_4_;
        uStack_1530._0_4_ = (float)uVar89;
        fStack_110 = (float)uStack_1530;
        uStack_1530._4_4_ = (float)((ulong)uVar89 >> 0x20);
        fStack_10c = uStack_1530._4_4_;
        uStack_1528._0_4_ = (float)uVar90;
        fStack_108 = (float)uStack_1528;
        uStack_1528._4_4_ = (float)((ulong)uVar90 >> 0x20);
        fStack_744 = uStack_1528._4_4_;
        local_140._0_4_ = (float)local_1560;
        local_140._4_4_ = (float)((ulong)local_1560 >> 0x20);
        uStack_138._0_4_ = (float)uStack_1558;
        uStack_138._4_4_ = (float)((ulong)uStack_1558 >> 0x20);
        uStack_130._0_4_ = (float)uStack_1550;
        uStack_130._4_4_ = (float)((ulong)uStack_1550 >> 0x20);
        uStack_128._0_4_ = (float)uStack_1548;
        local_760 = (float)local_1540 * (float)local_140;
        fStack_75c = local_1540._4_4_ * local_140._4_4_;
        fStack_758 = (float)uStack_1538 * (float)uStack_138;
        fStack_754 = uStack_1538._4_4_ * uStack_138._4_4_;
        fStack_750 = (float)uStack_1530 * (float)uStack_130;
        fStack_74c = uStack_1530._4_4_ * uStack_130._4_4_;
        fStack_748 = (float)uStack_1528 * (float)uStack_128;
        fVar103 = local_760 + fVar103;
        fVar105 = fStack_75c + fVar105;
        fVar106 = fStack_758 + fVar106;
        in_stack_ffffffffffffd62c = fStack_754 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_750 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_74c + in_stack_ffffffffffffd634;
        fVar107 = fStack_748 + fVar107;
        uStack_1528._4_4_ = uStack_1528._4_4_ + uStack_14c8._4_4_;
        local_15e0 = CONCAT44(fVar105,fVar103);
        uStack_15d8 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_15d0 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_15c8 = CONCAT44(uStack_1528._4_4_,fVar107);
        local_15a0._0_4_ = (float)uVar91;
        local_e0 = (float)local_15a0;
        local_15a0._4_4_ = (float)((ulong)uVar91 >> 0x20);
        fStack_dc = local_15a0._4_4_;
        uStack_1598._0_4_ = (float)uVar92;
        fStack_d8 = (float)uStack_1598;
        uStack_1598._4_4_ = (float)((ulong)uVar92 >> 0x20);
        fStack_d4 = uStack_1598._4_4_;
        uStack_1590._0_4_ = (float)uVar93;
        fStack_d0 = (float)uStack_1590;
        uStack_1590._4_4_ = (float)((ulong)uVar93 >> 0x20);
        fStack_cc = uStack_1590._4_4_;
        uStack_1588._0_4_ = (float)uVar94;
        fStack_c8 = (float)uStack_1588;
        uStack_1588._4_4_ = (float)((ulong)uVar94 >> 0x20);
        fStack_704 = uStack_1588._4_4_;
        local_100._0_4_ = (float)local_15c0;
        local_100._4_4_ = (float)((ulong)local_15c0 >> 0x20);
        uStack_f8._0_4_ = (float)uStack_15b8;
        uStack_f8._4_4_ = (float)((ulong)uStack_15b8 >> 0x20);
        uStack_f0._0_4_ = (float)uStack_15b0;
        uStack_f0._4_4_ = (float)((ulong)uStack_15b0 >> 0x20);
        uStack_e8._0_4_ = (float)uStack_15a8;
        local_720 = (float)local_15a0 * (float)local_100;
        fStack_71c = local_15a0._4_4_ * local_100._4_4_;
        fStack_718 = (float)uStack_1598 * (float)uStack_f8;
        fStack_714 = uStack_1598._4_4_ * uStack_f8._4_4_;
        fStack_710 = (float)uStack_1590 * (float)uStack_f0;
        fStack_70c = uStack_1590._4_4_ * uStack_f0._4_4_;
        fStack_708 = (float)uStack_1588 * (float)uStack_e8;
        fVar103 = local_720 + fVar103;
        fVar105 = fStack_71c + fVar105;
        fVar106 = fStack_718 + fVar106;
        in_stack_ffffffffffffd62c = fStack_714 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_710 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_70c + in_stack_ffffffffffffd634;
        fVar107 = fStack_708 + fVar107;
        uStack_1588._4_4_ = uStack_1588._4_4_ + uStack_1528._4_4_;
        local_1640 = CONCAT44(fVar105,fVar103);
        uStack_1638 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1630 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1628 = CONCAT44(uStack_1588._4_4_,fVar107);
        local_1600._0_4_ = (float)uVar95;
        local_a0 = (float)local_1600;
        local_1600._4_4_ = (float)((ulong)uVar95 >> 0x20);
        fStack_9c = local_1600._4_4_;
        uStack_15f8._0_4_ = (float)uVar96;
        fStack_98 = (float)uStack_15f8;
        uStack_15f8._4_4_ = (float)((ulong)uVar96 >> 0x20);
        fStack_94 = uStack_15f8._4_4_;
        uStack_15f0._0_4_ = (float)uVar97;
        fStack_90 = (float)uStack_15f0;
        uStack_15f0._4_4_ = (float)((ulong)uVar97 >> 0x20);
        fStack_8c = uStack_15f0._4_4_;
        uStack_15e8._0_4_ = (float)uVar98;
        fStack_88 = (float)uStack_15e8;
        uStack_15e8._4_4_ = (float)((ulong)uVar98 >> 0x20);
        fStack_6c4 = uStack_15e8._4_4_;
        local_c0._0_4_ = (float)local_1620;
        local_c0._4_4_ = (float)((ulong)local_1620 >> 0x20);
        uStack_b8._0_4_ = (float)uStack_1618;
        uStack_b8._4_4_ = (float)((ulong)uStack_1618 >> 0x20);
        uStack_b0._0_4_ = (float)uStack_1610;
        uStack_b0._4_4_ = (float)((ulong)uStack_1610 >> 0x20);
        uStack_a8._0_4_ = (float)uStack_1608;
        local_6e0 = (float)local_1600 * (float)local_c0;
        fStack_6dc = local_1600._4_4_ * local_c0._4_4_;
        fStack_6d8 = (float)uStack_15f8 * (float)uStack_b8;
        fStack_6d4 = uStack_15f8._4_4_ * uStack_b8._4_4_;
        fStack_6d0 = (float)uStack_15f0 * (float)uStack_b0;
        fStack_6cc = uStack_15f0._4_4_ * uStack_b0._4_4_;
        fStack_6c8 = (float)uStack_15e8 * (float)uStack_a8;
        fVar103 = local_6e0 + fVar103;
        fVar105 = fStack_6dc + fVar105;
        fVar106 = fStack_6d8 + fVar106;
        in_stack_ffffffffffffd62c = fStack_6d4 + in_stack_ffffffffffffd62c;
        in_stack_ffffffffffffd630 = fStack_6d0 + in_stack_ffffffffffffd630;
        in_stack_ffffffffffffd634 = fStack_6cc + in_stack_ffffffffffffd634;
        fVar107 = fStack_6c8 + fVar107;
        uStack_15e8._4_4_ = uStack_15e8._4_4_ + uStack_1588._4_4_;
        local_16a0 = CONCAT44(fVar105,fVar103);
        uStack_1698 = CONCAT44(in_stack_ffffffffffffd62c,fVar106);
        uStack_1690 = CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630);
        uStack_1688 = CONCAT44(uStack_15e8._4_4_,fVar107);
        local_1660._0_4_ = (float)uVar99;
        local_60 = (float)local_1660;
        local_1660._4_4_ = (float)((ulong)uVar99 >> 0x20);
        fStack_5c = local_1660._4_4_;
        uStack_1658._0_4_ = (float)uVar100;
        fStack_58 = (float)uStack_1658;
        uStack_1658._4_4_ = (float)((ulong)uVar100 >> 0x20);
        fStack_54 = uStack_1658._4_4_;
        uStack_1650._0_4_ = (float)uVar101;
        fStack_50 = (float)uStack_1650;
        uStack_1650._4_4_ = (float)((ulong)uVar101 >> 0x20);
        fStack_4c = uStack_1650._4_4_;
        uStack_1648._0_4_ = (float)uVar102;
        fStack_48 = (float)uStack_1648;
        uStack_1648._4_4_ = (float)((ulong)uVar102 >> 0x20);
        fStack_684 = uStack_1648._4_4_;
        local_80._0_4_ = (float)local_1680;
        local_80._4_4_ = (float)((ulong)local_1680 >> 0x20);
        uStack_78._0_4_ = (float)uStack_1678;
        uStack_78._4_4_ = (float)((ulong)uStack_1678 >> 0x20);
        uStack_70._0_4_ = (float)uStack_1670;
        uStack_70._4_4_ = (float)((ulong)uStack_1670 >> 0x20);
        uStack_68._0_4_ = (float)uStack_1668;
        local_6a0 = (float)local_1660 * (float)local_80;
        fStack_69c = local_1660._4_4_ * local_80._4_4_;
        fStack_698 = (float)uStack_1658 * (float)uStack_78;
        fStack_694 = uStack_1658._4_4_ * uStack_78._4_4_;
        fStack_690 = (float)uStack_1650 * (float)uStack_70;
        fStack_68c = uStack_1650._4_4_ * uStack_70._4_4_;
        fStack_688 = (float)uStack_1648 * (float)uStack_68;
        local_d40 = CONCAT44(fStack_69c + fVar105,local_6a0 + fVar103);
        uStack_d38 = CONCAT44(fStack_694 + in_stack_ffffffffffffd62c,fStack_698 + fVar106);
        uStack_d30 = CONCAT44(fStack_68c + in_stack_ffffffffffffd634,
                              fStack_690 + in_stack_ffffffffffffd630);
        uStack_d28 = CONCAT44(uStack_1648._4_4_ + uStack_15e8._4_4_,fStack_688 + fVar107);
        local_d08 = local_1920;
        *(undefined8 *)local_1920 = local_d40;
        *(undefined8 *)(local_1920 + 2) = uStack_d38;
        *(undefined8 *)(local_1920 + 4) = uStack_d30;
        *(undefined8 *)(local_1920 + 6) = uStack_d28;
        local_1970 = local_1970 + 0x10;
        local_1978 = local_1978 + 0x10;
        local_1980 = local_1980 + 0x10;
        local_1988 = local_1988 + 0x10;
        local_1990 = local_1990 + 0x10;
        local_1920 = local_1920 + 8;
        local_1660 = uVar99;
        uStack_1658 = uVar100;
        uStack_1650 = uVar101;
        uStack_1648 = uVar102;
        local_1600 = uVar95;
        uStack_15f8 = uVar96;
        uStack_15f0 = uVar97;
        uStack_15e8 = uVar98;
        local_15a0 = uVar91;
        uStack_1598 = uVar92;
        uStack_1590 = uVar93;
        uStack_1588 = uVar94;
        local_1540 = uVar87;
        uStack_1538 = uVar88;
        uStack_1530 = uVar89;
        uStack_1528 = uVar90;
        local_14e0 = uVar83;
        uStack_14d8 = uVar84;
        uStack_14d0 = uVar85;
        uStack_14c8 = uVar86;
        local_1480 = uVar79;
        uStack_1478 = uVar80;
        uStack_1470 = uVar81;
        uStack_1468 = uVar82;
        local_1420 = uVar75;
        uStack_1418 = uVar76;
        uStack_1410 = uVar77;
        uStack_1408 = uVar78;
        local_13c0 = uVar71;
        uStack_13b8 = uVar72;
        uStack_13b0 = uVar73;
        uStack_13a8 = uVar74;
        local_1360 = uVar67;
        uStack_1358 = uVar68;
        uStack_1350 = uVar69;
        uStack_1348 = uVar70;
        local_1300 = uVar63;
        uStack_12f8 = uVar64;
        uStack_12f0 = uVar65;
        uStack_12e8 = uVar66;
        local_12a0 = uVar59;
        uStack_1298 = uVar60;
        uStack_1290 = uVar61;
        uStack_1288 = uVar62;
        local_1240 = uVar55;
        uStack_1238 = uVar56;
        uStack_1230 = uVar57;
        uStack_1228 = uVar58;
        local_11e0 = uVar51;
        uStack_11d8 = uVar52;
        uStack_11d0 = uVar53;
        uStack_11c8 = uVar54;
        local_1180 = uVar47;
        uStack_1178 = uVar48;
        uStack_1170 = uVar49;
        uStack_1168 = uVar50;
        local_1120 = uVar43;
        uStack_1118 = uVar44;
        uStack_1110 = uVar45;
        uStack_1108 = uVar46;
        local_10c0 = uVar39;
        uStack_10b8 = uVar40;
        uStack_10b0 = uVar41;
        uStack_10a8 = uVar42;
        local_1060 = uVar35;
        uStack_1058 = uVar36;
        uStack_1050 = uVar37;
        uStack_1048 = uVar38;
        local_1000 = uVar31;
        uStack_ff8 = uVar32;
        uStack_ff0 = uVar33;
        uStack_fe8 = uVar34;
        local_fa0 = uVar27;
        uStack_f98 = uVar28;
        uStack_f90 = uVar29;
        uStack_f88 = uVar30;
        local_f40 = uVar23;
        uStack_f38 = uVar24;
        uStack_f30 = uVar25;
        uStack_f28 = uVar26;
        local_ee0 = uVar19;
        uStack_ed8 = uVar20;
        uStack_ed0 = uVar21;
        uStack_ec8 = uVar22;
        local_e80 = uVar15;
        uStack_e78 = uVar16;
        uStack_e70 = uVar17;
        uStack_e68 = uVar18;
        local_e20 = uVar11;
        uStack_e18 = uVar12;
        uStack_e10 = uVar13;
        uStack_e08 = uVar14;
        local_dc0 = uVar7;
        uStack_db8 = uVar8;
        uStack_db0 = uVar9;
        uStack_da8 = uVar10;
        local_d60 = uVar3;
        uStack_d58 = uVar4;
        uStack_d50 = uVar5;
        uStack_d48 = uVar6;
        local_cc0 = local_1900;
        uStack_cb8 = uStack_18f8;
        uStack_cb0 = uStack_18f0;
        uStack_ca8 = uStack_18e8;
        local_c80 = local_e00;
        uStack_c78 = uStack_df8;
        uStack_c70 = uStack_df0;
        uStack_c68 = uStack_de8;
        local_c40 = local_e60;
        uStack_c38 = uStack_e58;
        uStack_c30 = uStack_e50;
        uStack_c28 = uStack_e48;
        local_c00 = local_ec0;
        uStack_bf8 = uStack_eb8;
        uStack_bf0 = uStack_eb0;
        uStack_be8 = uStack_ea8;
        local_bc0 = local_f20;
        uStack_bb8 = uStack_f18;
        uStack_bb0 = uStack_f10;
        uStack_ba8 = uStack_f08;
        local_b80 = local_f80;
        uStack_b78 = uStack_f78;
        uStack_b70 = uStack_f70;
        uStack_b68 = uStack_f68;
        local_b40 = local_fe0;
        uStack_b38 = uStack_fd8;
        uStack_b30 = uStack_fd0;
        uStack_b28 = uStack_fc8;
        local_b00 = local_1040;
        uStack_af8 = uStack_1038;
        uStack_af0 = uStack_1030;
        uStack_ae8 = uStack_1028;
        local_ac0 = local_10a0;
        uStack_ab8 = uStack_1098;
        uStack_ab0 = uStack_1090;
        uStack_aa8 = uStack_1088;
        local_a80 = local_1100;
        uStack_a78 = uStack_10f8;
        uStack_a70 = uStack_10f0;
        uStack_a68 = uStack_10e8;
        local_a40 = local_1160;
        uStack_a38 = uStack_1158;
        uStack_a30 = uStack_1150;
        uStack_a28 = uStack_1148;
        local_a00 = local_11c0;
        uStack_9f8 = uStack_11b8;
        uStack_9f0 = uStack_11b0;
        uStack_9e8 = uStack_11a8;
        local_9c0 = local_1220;
        uStack_9b8 = uStack_1218;
        uStack_9b0 = uStack_1210;
        uStack_9a8 = uStack_1208;
        local_980 = local_1280;
        uStack_978 = uStack_1278;
        uStack_970 = uStack_1270;
        uStack_968 = uStack_1268;
        local_940 = local_12e0;
        uStack_938 = uStack_12d8;
        uStack_930 = uStack_12d0;
        uStack_928 = uStack_12c8;
        local_900 = local_1340;
        uStack_8f8 = uStack_1338;
        uStack_8f0 = uStack_1330;
        uStack_8e8 = uStack_1328;
        local_8c0 = local_13a0;
        uStack_8b8 = uStack_1398;
        uStack_8b0 = uStack_1390;
        uStack_8a8 = uStack_1388;
        local_880 = local_1400;
        uStack_878 = uStack_13f8;
        uStack_870 = uStack_13f0;
        uStack_868 = uStack_13e8;
        local_840 = local_1460;
        uStack_838 = uStack_1458;
        uStack_830 = uStack_1450;
        uStack_828 = uStack_1448;
        local_800 = local_14c0;
        uStack_7f8 = uStack_14b8;
        uStack_7f0 = uStack_14b0;
        uStack_7e8 = uStack_14a8;
        local_7c0 = local_1520;
        uStack_7b8 = uStack_1518;
        uStack_7b0 = uStack_1510;
        uStack_7a8 = uStack_1508;
        local_780 = local_1580;
        uStack_778 = uStack_1578;
        uStack_770 = uStack_1570;
        uStack_768 = uStack_1568;
        local_740 = local_15e0;
        uStack_738 = uStack_15d8;
        uStack_730 = uStack_15d0;
        uStack_728 = uStack_15c8;
        local_700 = local_1640;
        uStack_6f8 = uStack_1638;
        uStack_6f0 = uStack_1630;
        uStack_6e8 = uStack_1628;
        local_6c0 = local_16a0;
        uStack_6b8 = uStack_1698;
        uStack_6b0 = uStack_1690;
        uStack_6a8 = uStack_1688;
        local_680 = local_d80;
        uStack_678 = uStack_d78;
        uStack_670 = uStack_d70;
        uStack_668 = uStack_d68;
        fStack_644 = fStack_c84;
        local_640 = local_de0;
        uStack_638 = uStack_dd8;
        uStack_630 = uStack_dd0;
        uStack_628 = uStack_dc8;
        fStack_604 = fStack_c44;
        local_600 = local_e40;
        uStack_5f8 = uStack_e38;
        uStack_5f0 = uStack_e30;
        uStack_5e8 = uStack_e28;
        fStack_5c4 = fStack_c04;
        local_5c0 = local_ea0;
        uStack_5b8 = uStack_e98;
        uStack_5b0 = uStack_e90;
        uStack_5a8 = uStack_e88;
        fStack_584 = fStack_bc4;
        local_580 = local_f00;
        uStack_578 = uStack_ef8;
        uStack_570 = uStack_ef0;
        uStack_568 = uStack_ee8;
        fStack_544 = fStack_b84;
        local_540 = local_f60;
        uStack_538 = uStack_f58;
        uStack_530 = uStack_f50;
        uStack_528 = uStack_f48;
        fStack_504 = fStack_b44;
        local_500 = local_fc0;
        uStack_4f8 = uStack_fb8;
        uStack_4f0 = uStack_fb0;
        uStack_4e8 = uStack_fa8;
        fStack_4c4 = fStack_b04;
        local_4c0 = local_1020;
        uStack_4b8 = uStack_1018;
        uStack_4b0 = uStack_1010;
        uStack_4a8 = uStack_1008;
        fStack_484 = fStack_ac4;
        local_480 = local_1080;
        uStack_478 = uStack_1078;
        uStack_470 = uStack_1070;
        uStack_468 = uStack_1068;
        fStack_444 = fStack_a84;
        local_440 = local_10e0;
        uStack_438 = uStack_10d8;
        uStack_430 = uStack_10d0;
        uStack_428 = uStack_10c8;
        fStack_404 = fStack_a44;
        local_400 = local_1140;
        uStack_3f8 = uStack_1138;
        uStack_3f0 = uStack_1130;
        uStack_3e8 = uStack_1128;
        fStack_3c4 = fStack_a04;
        local_3c0 = local_11a0;
        uStack_3b8 = uStack_1198;
        uStack_3b0 = uStack_1190;
        uStack_3a8 = uStack_1188;
        fStack_384 = fStack_9c4;
        local_380 = local_1200;
        uStack_378 = uStack_11f8;
        uStack_370 = uStack_11f0;
        uStack_368 = uStack_11e8;
        fStack_344 = fStack_984;
        local_340 = local_1260;
        uStack_338 = uStack_1258;
        uStack_330 = uStack_1250;
        uStack_328 = uStack_1248;
        fStack_304 = fStack_944;
        local_300 = local_12c0;
        uStack_2f8 = uStack_12b8;
        uStack_2f0 = uStack_12b0;
        uStack_2e8 = uStack_12a8;
        fStack_2c4 = fStack_904;
        local_2c0 = local_1320;
        uStack_2b8 = uStack_1318;
        uStack_2b0 = uStack_1310;
        uStack_2a8 = uStack_1308;
        fStack_284 = fStack_8c4;
        local_280 = local_1380;
        uStack_278 = uStack_1378;
        uStack_270 = uStack_1370;
        uStack_268 = uStack_1368;
        fStack_244 = fStack_884;
        local_240 = local_13e0;
        uStack_238 = uStack_13d8;
        uStack_230 = uStack_13d0;
        uStack_228 = uStack_13c8;
        fStack_204 = fStack_844;
        local_200 = local_1440;
        uStack_1f8 = uStack_1438;
        uStack_1f0 = uStack_1430;
        uStack_1e8 = uStack_1428;
        fStack_1c4 = fStack_804;
        local_1c0 = local_14a0;
        uStack_1b8 = uStack_1498;
        uStack_1b0 = uStack_1490;
        uStack_1a8 = uStack_1488;
        fStack_184 = fStack_7c4;
        local_180 = local_1500;
        uStack_178 = uStack_14f8;
        uStack_170 = uStack_14f0;
        uStack_168 = uStack_14e8;
        fStack_144 = fStack_784;
        local_140 = local_1560;
        uStack_138 = uStack_1558;
        uStack_130 = uStack_1550;
        uStack_128 = uStack_1548;
        fStack_104 = fStack_744;
        local_100 = local_15c0;
        uStack_f8 = uStack_15b8;
        uStack_f0 = uStack_15b0;
        uStack_e8 = uStack_15a8;
        fStack_c4 = fStack_704;
        local_c0 = local_1620;
        uStack_b8 = uStack_1618;
        uStack_b0 = uStack_1610;
        uStack_a8 = uStack_1608;
        fStack_84 = fStack_6c4;
        local_80 = local_1680;
        uStack_78 = uStack_1678;
        uStack_70 = uStack_1670;
        uStack_68 = uStack_1668;
        fStack_44 = fStack_684;
      }
      local_1970 = local_1970 + local_187c;
      local_1978 = local_1978 + local_187c;
      local_1980 = local_1980 + local_187c;
      local_1988 = local_1988 + local_187c;
      local_1990 = local_1990 + local_187c;
    }
    Mat::~Mat((Mat *)0x67e141);
    Mat::~Mat((Mat *)0x67e14e);
  }
  return;
}

Assistant:

static void convdw5x5s2_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 8;

    const float* bias = _bias;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_loadu_ps(r0);
                __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                __m256 _r02 = _mm256_loadu_ps(r0 + 16);
                __m256 _r03 = _mm256_loadu_ps(r0 + 24);
                __m256 _r04 = _mm256_loadu_ps(r0 + 32);

                __m256 _k00 = _mm256_loadu_ps(k0);
                __m256 _k01 = _mm256_loadu_ps(k0 + 8);
                __m256 _k02 = _mm256_loadu_ps(k0 + 16);
                __m256 _k03 = _mm256_loadu_ps(k0 + 24);
                __m256 _k04 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);

                __m256 _r10 = _mm256_loadu_ps(r1);
                __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                __m256 _r12 = _mm256_loadu_ps(r1 + 16);
                __m256 _r13 = _mm256_loadu_ps(r1 + 24);
                __m256 _r14 = _mm256_loadu_ps(r1 + 32);

                __m256 _k10 = _mm256_loadu_ps(k0);
                __m256 _k11 = _mm256_loadu_ps(k0 + 8);
                __m256 _k12 = _mm256_loadu_ps(k0 + 16);
                __m256 _k13 = _mm256_loadu_ps(k0 + 24);
                __m256 _k14 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);

                __m256 _r20 = _mm256_loadu_ps(r2);
                __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                __m256 _r22 = _mm256_loadu_ps(r2 + 16);
                __m256 _r23 = _mm256_loadu_ps(r2 + 24);
                __m256 _r24 = _mm256_loadu_ps(r2 + 32);

                __m256 _k20 = _mm256_loadu_ps(k0);
                __m256 _k21 = _mm256_loadu_ps(k0 + 8);
                __m256 _k22 = _mm256_loadu_ps(k0 + 16);
                __m256 _k23 = _mm256_loadu_ps(k0 + 24);
                __m256 _k24 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k24, _r24, _sum0);

                __m256 _r30 = _mm256_loadu_ps(r3);
                __m256 _r31 = _mm256_loadu_ps(r3 + 8);
                __m256 _r32 = _mm256_loadu_ps(r3 + 16);
                __m256 _r33 = _mm256_loadu_ps(r3 + 24);
                __m256 _r34 = _mm256_loadu_ps(r3 + 32);

                __m256 _k30 = _mm256_loadu_ps(k0);
                __m256 _k31 = _mm256_loadu_ps(k0 + 8);
                __m256 _k32 = _mm256_loadu_ps(k0 + 16);
                __m256 _k33 = _mm256_loadu_ps(k0 + 24);
                __m256 _k34 = _mm256_loadu_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k34, _r34, _sum0);

                __m256 _r40 = _mm256_loadu_ps(r4);
                __m256 _r41 = _mm256_loadu_ps(r4 + 8);
                __m256 _r42 = _mm256_loadu_ps(r4 + 16);
                __m256 _r43 = _mm256_loadu_ps(r4 + 24);
                __m256 _r44 = _mm256_loadu_ps(r4 + 32);

                __m256 _k40 = _mm256_loadu_ps(k0);
                __m256 _k41 = _mm256_loadu_ps(k0 + 8);
                __m256 _k42 = _mm256_loadu_ps(k0 + 16);
                __m256 _k43 = _mm256_loadu_ps(k0 + 24);
                __m256 _k44 = _mm256_loadu_ps(k0 + 32);
                k0 -= 160;

                _sum0 = _mm256_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm256_storeu_ps(outptr0, _sum0);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                r3 += 16;
                r4 += 16;
                outptr0 += 8;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}